

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-merge.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  __node_base_ptr *__dest;
  size_type *psVar1;
  size_t *__dest_00;
  size_type *psVar2;
  size_type *psVar3;
  PassOptions **this;
  pointer pcVar4;
  size_t sVar5;
  pointer puVar6;
  Function *__k;
  pointer puVar7;
  Global *__k_00;
  pointer puVar8;
  Tag *__k_01;
  pointer puVar9;
  string_view *__k_02;
  pointer puVar10;
  Memory *__k_03;
  pointer puVar11;
  DataSegment *__k_04;
  pointer puVar12;
  Table *__k_05;
  pointer puVar13;
  Export *pEVar14;
  Expression *left;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  key_type *pkVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  size_t sVar20;
  char *pcVar21;
  undefined8 *puVar22;
  ulong *puVar23;
  undefined8 *puVar24;
  atomic<MixedArena_*> aVar25;
  char cVar26;
  uint uVar27;
  string *psVar28;
  map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *pmVar29;
  ostream *poVar30;
  Module *this_00;
  _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *p_Var31;
  mapped_type *pmVar32;
  mapped_type *pmVar33;
  undefined8 uVar34;
  long lVar35;
  undefined8 uVar36;
  Call *right;
  Block *pBVar37;
  __node_ptr p_Var38;
  _Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *p_Var39;
  const_iterator cVar40;
  mapped_type *pmVar41;
  Importable *import_00;
  map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *pmVar42;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *args;
  undefined1 auVar43 [8];
  unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *import_3;
  undefined8 *puVar44;
  key_type *__k_06;
  size_type *psVar45;
  unordered_map<wasm::Export_*,_(anonymous_namespace)::ExportInfo,_std::hash<wasm::Export_*>,_std::equal_to<wasm::Export_*>,_std::allocator<std::pair<wasm::Export_*const,_(anonymous_namespace)::ExportInfo>_>_>
  *__k_07;
  char *pcVar46;
  char *pcVar47;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *import;
  ulong *puVar48;
  undefined8 *puVar49;
  undefined8 *puVar50;
  undefined8 *puVar51;
  pointer __p;
  pointer puVar52;
  long lVar53;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *curr;
  pointer puVar54;
  pointer puVar55;
  pointer puVar56;
  pointer puVar57;
  pointer puVar58;
  pointer puVar59;
  pointer puVar60;
  bool bVar61;
  Name NVar62;
  undefined1 auVar63 [16];
  string_view sVar64;
  Name NVar65;
  Name NVar66;
  Name NVar67;
  Name NVar68;
  Name NVar69;
  Name NVar70;
  Name NVar71;
  optional<wasm::Type> type;
  undefined1 local_9b8 [8];
  ToolOptions options;
  map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  inputSourceMapFilenames;
  size_type **local_7e8;
  undefined8 uStack_7e0;
  code *local_7d8;
  code *pcStack_7d0;
  undefined8 local_7c8;
  undefined8 uStack_7c0;
  code *local_7b8;
  code *local_7b0;
  undefined8 local_7a8;
  undefined8 uStack_7a0;
  code *local_798;
  code *local_790;
  undefined1 *local_788;
  undefined8 uStack_780;
  code *local_778;
  code *pcStack_770;
  undefined1 *local_768;
  undefined8 uStack_760;
  code *local_758;
  code *pcStack_750;
  long *local_748 [2];
  long local_738 [2];
  char local_728;
  long *local_720 [2];
  long local_710 [2];
  char local_700;
  long *local_6f8 [2];
  long local_6e8 [2];
  long *local_6d8 [2];
  long local_6c8 [2];
  long *local_6b8 [2];
  long local_6a8 [2];
  long *local_698 [2];
  long local_688 [2];
  long *local_678 [2];
  long local_668 [2];
  long *local_658 [2];
  long local_648 [2];
  long *local_638 [2];
  long local_628 [2];
  long *local_618 [2];
  long local_608 [2];
  long *local_5f8 [2];
  long local_5e8 [2];
  long *local_5d8 [2];
  long local_5c8 [2];
  long *local_5b8 [2];
  long local_5a8 [2];
  long *local_598 [2];
  long local_588 [2];
  long *local_578 [2];
  long local_568 [2];
  long *local_558 [2];
  long local_548 [2];
  long *local_538 [2];
  long local_528 [2];
  long *local_518 [2];
  long local_508 [2];
  long *local_4f8 [2];
  long local_4e8 [2];
  long *local_4d8 [2];
  long local_4c8 [2];
  long *local_4b8 [2];
  long local_4a8 [2];
  long *local_498 [2];
  long local_488 [2];
  long *local_478 [2];
  long local_468 [2];
  long *local_458 [2];
  long local_448 [2];
  long *local_438 [2];
  long local_428 [2];
  undefined1 auStack_418 [8];
  Builder builder;
  size_type *local_3f8;
  string outputSourceMapFilename;
  long local_3c8 [2];
  undefined1 auStack_3b8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  inputFileNames;
  undefined1 auStack_398 [8];
  ModuleWriter writer;
  pointer puStack_2f0;
  __uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_> *local_2e8;
  pointer local_2e0;
  size_t local_2d8;
  char *pcStack_2d0;
  undefined4 local_2c8;
  pointer local_2c0;
  __uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_> _Stack_2b8;
  undefined2 local_2b0;
  size_type *local_208;
  string outputSourceMapUrl;
  ModuleReader reader;
  undefined1 auStack_1c8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  inputFiles;
  string WasmMergeOption;
  unique_ptr<wasm::Module,_std::default_delete<wasm::Module>_> laterInput;
  size_t local_180 [2];
  atomic<MixedArena_*> local_170;
  undefined1 local_168 [40];
  undefined1 local_140 [8];
  __single_object copy;
  __node_base local_130;
  char *pcStack_128;
  float local_120;
  size_type local_118;
  undefined1 auStack_110 [8];
  size_type *psStack_108;
  value_type inputFileName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> inputSourceMapFilename;
  value_type inputFile;
  undefined1 local_a0 [8];
  KindModuleExportMaps kindModuleExportMaps;
  bool valid;
  undefined1 local_32;
  undefined1 local_31 [7];
  bool emitBinary;
  bool debugInfo;
  
  auStack_1c8 = (undefined1  [8])0x0;
  inputFiles.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  inputFiles.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  inputFileNames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  auStack_3b8 = (undefined1  [8])0x0;
  inputFileNames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_32 = 1;
  local_31[0] = 0;
  inputSourceMapFilenames._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&inputSourceMapFilenames;
  inputSourceMapFilenames._M_t._M_impl._0_4_ = 0;
  inputSourceMapFilenames._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  inputSourceMapFilenames._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  inputSourceMapFilenames._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_3f8 = &outputSourceMapFilename._M_string_length;
  outputSourceMapFilename._M_dataplus._M_p = (pointer)0x0;
  outputSourceMapFilename._M_string_length._0_1_ = 0;
  local_208 = &outputSourceMapUrl._M_string_length;
  outputSourceMapUrl._M_dataplus._M_p = (pointer)0x0;
  outputSourceMapUrl._M_string_length._0_1_ = 0;
  inputFiles.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&WasmMergeOption._M_string_length;
  inputSourceMapFilenames._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       inputSourceMapFilenames._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)
             &inputFiles.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,"wasm-merge options","");
  auStack_398 = (undefined1  [8])&writer.options;
  std::__cxx11::string::_M_construct<char_const*>((string *)auStack_398,"wasm-merge","");
  psVar1 = &kindModuleExportMaps._M_h._M_bucket_count;
  local_a0 = (undefined1  [8])psVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_a0,
             "Merge wasm files into one.\n\nFor example,\n\n  wasm-merge foo.wasm foo bar.wasm bar -o merged.wasm\n\nwill read foo.wasm and bar.wasm, with names \'foo\' and \'bar\' respectively, so if the second imports from \'foo\', we will see that as an import from the first module after the merge. The merged output will be written to merged.wasm.\n\nNote that filenames and modules names are interleaved (which is hopefully less confusing).\n\nInput source maps can be specified by adding an -ism option right after the module name:\n\n  wasm-merge foo.wasm foo -ism foo.wasm.map ..."
             ,"");
  wasm::ToolOptions::ToolOptions((ToolOptions *)local_9b8,(string *)auStack_398,(string *)local_a0);
  if (local_a0 != (undefined1  [8])psVar1) {
    operator_delete((void *)local_a0,kindModuleExportMaps._M_h._M_bucket_count + 1);
  }
  if (auStack_398 != (undefined1  [8])&writer.options) {
    operator_delete((void *)auStack_398,(ulong)&(writer.options)->validate);
  }
  auStack_398 = (undefined1  [8])&writer.options;
  std::__cxx11::string::_M_construct<char_const*>((string *)auStack_398,"--output","");
  local_a0 = (undefined1  [8])psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"-o","");
  local_140 = (undefined1  [8])&stack0xfffffffffffffed0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_140,"Output file","");
  kindModuleExportMaps._M_h._M_single_bucket = (__node_base_ptr)0x0;
  psVar28 = (string *)
            wasm::Options::add((string *)&options,(string *)auStack_398,(string *)local_a0,
                               (string *)local_140,(int)&inputFiles + 0x10,(function *)0x1,
                               (bool)((char)&kindModuleExportMaps + '0'));
  inputSourceMapFilename.field_2._8_8_ = &inputFile._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&inputSourceMapFilename.field_2 + 8),
             "INFILE1 NAME1 INFILE2 NAME2 [..]","");
  inputFileName.field_2._M_allocated_capacity =
       (size_type)
       std::
       _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-merge.cpp:602:21)>
       ::_M_invoke;
  inputFileName._M_string_length =
       (size_type)
       std::
       _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-merge.cpp:602:21)>
       ::_M_manager;
  psStack_108 = (size_type *)auStack_1c8;
  inputFileName._M_dataplus._M_p = auStack_3b8;
  psVar28 = (string *)
            wasm::Options::add_positional
                      (psVar28,(int)&inputSourceMapFilename + 0x18,(function *)0x2);
  inputFileName.field_2._8_8_ = &inputSourceMapFilename._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&inputFileName.field_2 + 8),"--input-source-map","");
  local_168._0_8_ = local_168 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"-ism","");
  outputSourceMapUrl.field_2._8_8_ = &reader.skipFunctionBodies;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&outputSourceMapUrl.field_2 + 8),
             "Consume source maps from the specified files","");
  auStack_418 = (undefined1  [8])0x0;
  builder.wasm = (Module *)0x0;
  auStack_418 = (undefined1  [8])operator_new(0x18);
  *(undefined1 **)auStack_418 = auStack_1c8;
  *(undefined1 **)((long)auStack_418 + 8) = auStack_3b8;
  *(FeatureSet **)((long)auStack_418 + 0x10) = &options.enabledFeatures;
  psVar28 = (string *)
            wasm::Options::add(psVar28,(string *)(inputFileName.field_2._M_local_buf + 8),
                               (string *)local_168,
                               (string *)(outputSourceMapUrl.field_2._M_local_buf + 8),
                               (int)&inputFiles + 0x10,(function *)0x2,SUB81(auStack_418,0));
  WasmMergeOption.field_2._8_8_ = local_180;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&WasmMergeOption.field_2 + 8),"--output-source-map","");
  local_5d8[0] = local_5c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5d8,"-osm","");
  local_5b8[0] = local_5a8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_5b8,"Emit source map to the specified file","");
  inputSourceMapFilenames._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)&local_3f8;
  psVar28 = (string *)
            wasm::Options::add(psVar28,(string *)(WasmMergeOption.field_2._M_local_buf + 8),
                               (string *)local_5d8,(string *)local_5b8,(int)&inputFiles + 0x10,
                               (function *)0x1,(bool)((char)&inputSourceMapFilenames + '('));
  local_598[0] = local_588;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_598,"--output-source-map-url","");
  local_578[0] = local_568;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_578,"-osu","");
  local_558[0] = local_548;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_558,"Emit specified string as source map URL","");
  uStack_7e0 = 0;
  local_7e8 = &local_208;
  pcStack_7d0 = std::
                _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-merge.cpp:637:10)>
                ::_M_invoke;
  local_7d8 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-merge.cpp:637:10)>
              ::_M_manager;
  psVar28 = (string *)
            wasm::Options::add(psVar28,(string *)local_598,(string *)local_578,(string *)local_558,
                               (int)&inputFiles + 0x10,(function *)0x1,SUB81(&local_7e8,0));
  local_538[0] = local_528;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_538,"--rename-export-conflicts","");
  local_518[0] = local_508;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_518,"-rec","");
  local_4f8[0] = local_4e8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_4f8,"Rename exports to avoid conflicts (rather than error)","");
  local_7c8 = 0;
  uStack_7c0 = 0;
  local_7b0 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-merge.cpp:645:10)>
              ::_M_invoke;
  local_7b8 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-merge.cpp:645:10)>
              ::_M_manager;
  psVar28 = (string *)
            wasm::Options::add(psVar28,(string *)local_538,(string *)local_518,(string *)local_4f8,
                               (int)&inputFiles + 0x10,(function *)0x0,SUB81(&local_7c8,0));
  local_4d8[0] = local_4c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4d8,"--skip-export-conflicts","");
  local_4b8[0] = local_4a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4b8,"-sec","");
  local_498[0] = local_488;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_498,"Skip exports that conflict with previous ones","");
  local_7a8 = 0;
  uStack_7a0 = 0;
  local_790 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-merge.cpp:653:10)>
              ::_M_invoke;
  local_798 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-merge.cpp:653:10)>
              ::_M_manager;
  psVar28 = (string *)
            wasm::Options::add(psVar28,(string *)local_4d8,(string *)local_4b8,(string *)local_498,
                               (int)&inputFiles + 0x10,(function *)0x0,SUB81(&local_7a8,0));
  local_478[0] = local_468;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_478,"--emit-text","");
  inputFile.field_2._8_4_ = argc;
  local_458[0] = local_448;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_458,"-S","");
  local_6f8[0] = local_6e8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_6f8,"Emit text instead of binary for the output file","");
  uStack_780 = 0;
  local_788 = &local_32;
  pcStack_770 = std::
                _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-merge.cpp:661:10)>
                ::_M_invoke;
  local_778 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-merge.cpp:661:10)>
              ::_M_manager;
  psVar28 = (string *)
            wasm::Options::add(psVar28,(string *)local_478,(string *)local_458,(string *)local_6f8,
                               (int)&inputFiles + 0x10,(function *)0x0,SUB81(&local_788,0));
  local_6d8[0] = local_6c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_6d8,"--debuginfo","");
  local_6b8[0] = local_6a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_6b8,"-g","");
  local_698[0] = local_688;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_698,"Emit names section and debug info","");
  uStack_760 = 0;
  local_768 = local_31;
  pcStack_750 = std::
                _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-merge.cpp:667:10)>
                ::_M_invoke;
  local_758 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-merge.cpp:667:10)>
              ::_M_manager;
  wasm::Options::add(psVar28,(string *)local_6d8,(string *)local_6b8,(string *)local_698,
                     (int)&inputFiles + 0x10,(function *)0x0,SUB81(&local_768,0));
  if (local_758 != (code *)0x0) {
    (*local_758)(&local_768,&local_768,3);
  }
  if (local_698[0] != local_688) {
    operator_delete(local_698[0],local_688[0] + 1);
  }
  if (local_6b8[0] != local_6a8) {
    operator_delete(local_6b8[0],local_6a8[0] + 1);
  }
  if (local_6d8[0] != local_6c8) {
    operator_delete(local_6d8[0],local_6c8[0] + 1);
  }
  if (local_778 != (code *)0x0) {
    (*local_778)(&local_788,&local_788,3);
  }
  if (local_6f8[0] != local_6e8) {
    operator_delete(local_6f8[0],local_6e8[0] + 1);
  }
  if (local_458[0] != local_448) {
    operator_delete(local_458[0],local_448[0] + 1);
  }
  if (local_478[0] != local_468) {
    operator_delete(local_478[0],local_468[0] + 1);
  }
  if (local_798 != (code *)0x0) {
    (*local_798)(&local_7a8,&local_7a8,3);
  }
  if (local_498[0] != local_488) {
    operator_delete(local_498[0],local_488[0] + 1);
  }
  if (local_4b8[0] != local_4a8) {
    operator_delete(local_4b8[0],local_4a8[0] + 1);
  }
  if (local_4d8[0] != local_4c8) {
    operator_delete(local_4d8[0],local_4c8[0] + 1);
  }
  if (local_7b8 != (code *)0x0) {
    (*local_7b8)(&local_7c8,&local_7c8,3);
  }
  if (local_4f8[0] != local_4e8) {
    operator_delete(local_4f8[0],local_4e8[0] + 1);
  }
  if (local_518[0] != local_508) {
    operator_delete(local_518[0],local_508[0] + 1);
  }
  if (local_538[0] != local_528) {
    operator_delete(local_538[0],local_528[0] + 1);
  }
  if (local_7d8 != (code *)0x0) {
    (*local_7d8)(&local_7e8,&local_7e8,3);
  }
  if (local_558[0] != local_548) {
    operator_delete(local_558[0],local_548[0] + 1);
  }
  if (local_578[0] != local_568) {
    operator_delete(local_578[0],local_568[0] + 1);
  }
  if (local_598[0] != local_588) {
    operator_delete(local_598[0],local_588[0] + 1);
  }
  __dest_00 = &inputSourceMapFilenames._M_t._M_impl.super__Rb_tree_header._M_node_count;
  std::
  _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-merge.cpp:629:10)>
  ::_M_manager((_Any_data *)__dest_00,(_Any_data *)__dest_00,__destroy_functor);
  if (local_5b8[0] != local_5a8) {
    operator_delete(local_5b8[0],local_5a8[0] + 1);
  }
  if (local_5d8[0] != local_5c8) {
    operator_delete(local_5d8[0],local_5c8[0] + 1);
  }
  if ((size_t *)WasmMergeOption.field_2._8_8_ != local_180) {
    operator_delete((void *)WasmMergeOption.field_2._8_8_,local_180[0] + 1);
  }
  std::
  _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-merge.cpp:614:10)>
  ::_M_manager((_Any_data *)auStack_418,(_Any_data *)auStack_418,__destroy_functor);
  if ((bool *)outputSourceMapUrl.field_2._8_8_ != &reader.skipFunctionBodies) {
    operator_delete((void *)outputSourceMapUrl.field_2._8_8_,
                    (ulong)((long)&stack0xfffffffffffffe28->_M_nxt + 1));
  }
  if ((string_view *)local_168._0_8_ != (string_view *)(local_168 + 0x10)) {
    operator_delete((void *)local_168._0_8_,(ulong)((long)(_Hash_node_base **)local_168._16_8_ + 1))
    ;
  }
  if ((size_type *)inputFileName.field_2._8_8_ != &inputSourceMapFilename._M_string_length) {
    operator_delete((void *)inputFileName.field_2._8_8_,inputSourceMapFilename._M_string_length + 1)
    ;
  }
  if (inputFileName._M_string_length != 0) {
    (*(code *)inputFileName._M_string_length)(&psStack_108,&psStack_108,3);
  }
  if ((size_type *)inputSourceMapFilename.field_2._8_8_ != &inputFile._M_string_length) {
    operator_delete((void *)inputSourceMapFilename.field_2._8_8_,inputFile._M_string_length + 1);
  }
  __dest = &kindModuleExportMaps._M_h._M_single_bucket;
  std::
  _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-merge.cpp:596:10)>
  ::_M_manager((_Any_data *)__dest,(_Any_data *)__dest,__destroy_functor);
  if (local_140 != (undefined1  [8])&stack0xfffffffffffffed0) {
    operator_delete((void *)local_140,(ulong)((long)&(local_130._M_nxt)->_M_nxt + 1));
  }
  if (local_a0 != (undefined1  [8])&kindModuleExportMaps._M_h._M_bucket_count) {
    operator_delete((void *)local_a0,kindModuleExportMaps._M_h._M_bucket_count + 1);
  }
  if (auStack_398 != (undefined1  [8])&writer.options) {
    operator_delete((void *)auStack_398,(ulong)&(writer.options)->validate);
  }
  wasm::Options::parse((int)&options,(char **)(inputFile.field_2._8_8_ & 0xffffffff));
  import_00 = (Importable *)
              ((long)inputFileNames.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start - (long)auStack_3b8);
  if ((Importable *)
      ((long)inputFiles.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start - (long)auStack_1c8) == import_00) {
    if ((undefined1  [8])
        inputFiles.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != auStack_1c8) {
      local_170._M_b._M_p = (__base_type)(__pointer_type)0x0;
      do {
        aVar25._M_b._M_p = local_170._M_b._M_p;
        inputSourceMapFilename.field_2._8_8_ = &inputFile._M_string_length;
        pcVar4 = (((pointer)((long)auStack_1c8 + local_170._M_b._M_p * 0x20))->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)((long)&inputSourceMapFilename.field_2 + 8),pcVar4,
                   pcVar4 + ((pointer)((long)auStack_1c8 + local_170._M_b._M_p * 0x20))->
                            _M_string_length);
        psStack_108 = &inputFileName._M_string_length;
        pcVar4 = (((pointer)((long)auStack_3b8 + aVar25._M_b._M_p * 0x20))->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&psStack_108,pcVar4,
                   pcVar4 + ((pointer)((long)auStack_3b8 + aVar25._M_b._M_p * 0x20))->
                            _M_string_length);
        pmVar29 = &inputSourceMapFilenames;
        for (pmVar42 = (map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)inputSourceMapFilenames._M_t._M_impl.super__Rb_tree_header._M_header._0_8_
            ; pmVar42 !=
              (map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)0x0; pmVar42 = (map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)(&(pmVar42->_M_t)._M_impl.super__Rb_tree_header._M_header.
                                     _M_parent)[bVar61]) {
          bVar61 = (__pointer_type)(pmVar42->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right
                   < (ulong)aVar25._M_b._M_p;
          if (!bVar61) {
            pmVar29 = pmVar42;
          }
        }
        pmVar42 = &inputSourceMapFilenames;
        if ((pmVar29 != &inputSourceMapFilenames) &&
           (pmVar42 = pmVar29,
           (ulong)aVar25._M_b._M_p <
           (__pointer_type)(pmVar29->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right)) {
          pmVar42 = &inputSourceMapFilenames;
        }
        inputFileName.field_2._8_8_ = &inputSourceMapFilename._M_string_length;
        if (pmVar42 == &inputSourceMapFilenames) {
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)((long)&inputFileName.field_2 + 8));
        }
        else {
          sVar5 = (pmVar42->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)((long)&inputFileName.field_2 + 8),sVar5,
                     *(long *)&pmVar42[1]._M_t._M_impl + sVar5);
        }
        if ((char)options._vptr_ToolOptions == '\x01') {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"reading input \'",0xf);
          poVar30 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cerr,(char *)inputSourceMapFilename.field_2._8_8_,
                               (long)inputFile._M_dataplus._M_p);
          std::__ostream_insert<char,std::char_traits<char>>(poVar30,"\' as \'",6);
          poVar30 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar30,(char *)psStack_108,(long)inputFileName._M_dataplus._M_p);
          std::__ostream_insert<char,std::char_traits<char>>(poVar30,"\'...\n",5);
        }
        WasmMergeOption.field_2._8_8_ = 0;
        uVar36 = (Module *)&(anonymous_namespace)::merged;
        if ((uint)local_170._M_b._M_p != 0) {
          this_00 = (Module *)operator_new(0x3f0);
          memset(this_00,0,0x3f0);
          wasm::Module::Module(this_00);
          uVar36 = WasmMergeOption.field_2._8_8_;
          auStack_398 = (undefined1  [8])0x0;
          bVar61 = WasmMergeOption.field_2._8_8_ != 0;
          WasmMergeOption.field_2._8_8_ = this_00;
          if (bVar61) {
            wasm::Module::~Module((Module *)uVar36);
            operator_delete((void *)uVar36,0x3f0);
          }
          std::unique_ptr<wasm::Module,_std::default_delete<wasm::Module>_>::~unique_ptr
                    ((unique_ptr<wasm::Module,_std::default_delete<wasm::Module>_> *)auStack_398);
          uVar36 = WasmMergeOption.field_2._8_8_;
        }
        uVar27 = (((Module *)uVar36)->features).features | options._368_4_;
        (((Module *)uVar36)->features).features = uVar27;
        (((Module *)uVar36)->features).features = ~options.profile & uVar27;
        outputSourceMapUrl.field_2._10_6_ =
             (uint6)((ulong)outputSourceMapUrl.field_2._8_8_ >> 0x10) & 0xffff;
        reader.super_ModuleIOBase.debugInfo = false;
        outputSourceMapUrl.field_2._8_2_ = 1;
        outputSourceMapFilename.field_2._8_8_ = local_3c8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)((long)&outputSourceMapFilename.field_2 + 8),
                   inputSourceMapFilename.field_2._8_8_,
                   inputFile._M_dataplus._M_p + inputSourceMapFilename.field_2._8_8_);
        local_438[0] = local_428;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_438,inputFileName.field_2._8_8_,
                   inputSourceMapFilename._M_dataplus._M_p + inputFileName.field_2._8_8_);
        wasm::ModuleReader::read
                  ((undefined1 *)((long)&outputSourceMapUrl.field_2 + 8),
                   (undefined1 *)((long)&outputSourceMapFilename.field_2 + 8),uVar36,
                   (string *)local_438);
        if (local_438[0] != local_428) {
          operator_delete(local_438[0],local_428[0] + 1);
        }
        if ((long *)outputSourceMapFilename.field_2._8_8_ != local_3c8) {
          operator_delete((void *)outputSourceMapFilename.field_2._8_8_,local_3c8[0] + 1);
        }
        if (options.passOptions.passesToSkip._M_h._M_single_bucket._1_1_ == '\0') {
          std::
          _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::clear(&(((Module *)uVar36)->typeIndices)._M_h);
        }
        if ((options._177_1_ != '\0') &&
           (cVar26 = wasm::WasmValidator::validate((Module *)auStack_398,(uint)uVar36),
           cVar26 == '\0')) {
          poVar30 = (ostream *)std::operator<<((ostream *)&std::cout,(Module *)uVar36);
          auStack_398[0] = 10;
          std::__ostream_insert<char,std::char_traits<char>>(poVar30,auStack_398,1);
          wasm::Fatal::Fatal((Fatal *)auStack_398);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&writer.options,"error in validating input: ",0x1b);
          wasm::Fatal::operator<<
                    ((Fatal *)auStack_398,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&inputSourceMapFilename.field_2 + 8));
          goto LAB_0010dd72;
        }
        puVar23 = DAT_00127330;
        puVar48 = (anonymous_namespace)::merged;
        if (WasmMergeOption.field_2._8_8_ == 0) {
          for (; puVar48 != puVar23; puVar48 = puVar48 + 1) {
            psVar45 = psStack_108;
            sVar64 = (string_view)
                     wasm::IString::interned(inputFileName._M_dataplus._M_p,psStack_108,0);
            local_a0 = (undefined1  [8])*puVar48;
            auStack_398 = *(undefined1 (*) [8])local_a0;
            writer._0_8_ = ((__node_base *)((long)local_a0 + 8))->_M_nxt;
            pmVar33 = std::
                      unordered_map<wasm::Export_*,_(anonymous_namespace)::ExportInfo,_std::hash<wasm::Export_*>,_std::equal_to<wasm::Export_*>,_std::allocator<std::pair<wasm::Export_*const,_(anonymous_namespace)::ExportInfo>_>_>
                      ::operator[]((unordered_map<wasm::Export_*,_(anonymous_namespace)::ExportInfo,_std::hash<wasm::Export_*>,_std::equal_to<wasm::Export_*>,_std::allocator<std::pair<wasm::Export_*const,_(anonymous_namespace)::ExportInfo>_>_>
                                    *)local_a0,(key_type *)psVar45);
            (pmVar33->moduleName).super_IString.str = sVar64;
            *(undefined4 *)&(pmVar33->baseName).super_IString.str._M_len = auStack_398._0_4_;
            *(undefined4 *)((long)&(pmVar33->baseName).super_IString.str._M_len + 4) =
                 auStack_398._4_4_;
            *(undefined4 *)&(pmVar33->baseName).super_IString.str._M_str = writer._0_4_;
            *(undefined4 *)((long)&(pmVar33->baseName).super_IString.str._M_str + 4) = writer._4_4_;
          }
        }
        else {
          auVar63 = wasm::IString::interned(inputFileName._M_dataplus._M_p,psStack_108,0);
          inputFile.field_2._8_8_ = auVar63._8_8_;
          auStack_398 = (undefined1  [8])&writer.symbolMap.field_2;
          writer.super_ModuleIOBase.debugInfo = true;
          writer._1_7_ = 0;
          writer.options = (PassOptions *)0x0;
          writer.binary = false;
          writer.emitModuleName = false;
          writer._18_6_ = 0;
          writer.symbolMap._M_dataplus._M_p._0_4_ = 0x3f800000;
          writer.symbolMap._M_string_length._0_1_ = 0;
          writer.symbolMap._M_string_length._1_7_ = 0;
          writer.symbolMap.field_2._M_local_buf[0] = '\0';
          writer.symbolMap.field_2._M_allocated_capacity._1_2_ = 0;
          writer.symbolMap.field_2._M_local_buf[3] = '\0';
          writer.symbolMap.field_2._M_allocated_capacity._4_4_ = 0;
          puVar6 = (((Module *)uVar36)->functions).
                   super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (puVar54 = (((Module *)uVar36)->functions).
                         super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start; puVar54 != puVar6;
              puVar54 = puVar54 + 1) {
            sVar64 = (string_view)
                     wasm::Names::getValidFunctionName
                               ((Module *)&(anonymous_namespace)::merged,
                                (IString)*(IString *)
                                          &(((puVar54->_M_t).
                                             super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                                             .super__Head_base<0UL,_wasm::Function_*,_false>.
                                            _M_head_impl)->super_Importable).super_Named);
            __k = (puVar54->_M_t).
                  super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
                  super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                  super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
            local_a0 = (undefined1  [8])((ulong)local_a0 & 0xffffffff00000000);
            if (*(char **)((long)&(__k->super_Importable).super_Named + 8) != sVar64._M_str) {
              p_Var31 = (_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)std::__detail::
                           _Map_base<wasm::ModuleItemKind,_std::pair<const_wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>,_std::allocator<std::pair<const_wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::ModuleItemKind>,_std::hash<wasm::ModuleItemKind>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           ::operator[]((_Map_base<wasm::ModuleItemKind,_std::pair<const_wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>,_std::allocator<std::pair<const_wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::ModuleItemKind>,_std::hash<wasm::ModuleItemKind>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                         *)auStack_398,(key_type *)local_a0);
              pmVar32 = std::__detail::
                        _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                        ::operator[](p_Var31,(key_type *)__k);
              (pmVar32->super_IString).str = sVar64;
              *(string_view *)&(__k->super_Importable).super_Named = sVar64;
            }
          }
          puVar7 = (((Module *)uVar36)->globals).
                   super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (puVar55 = (((Module *)uVar36)->globals).
                         super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start; puVar55 != puVar7;
              puVar55 = puVar55 + 1) {
            sVar64 = (string_view)
                     wasm::Names::getValidGlobalName
                               ((Module *)&(anonymous_namespace)::merged,
                                (IString)*(IString *)
                                          &(((puVar55->_M_t).
                                             super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>
                                             .super__Head_base<0UL,_wasm::Global_*,_false>.
                                            _M_head_impl)->super_Importable).super_Named);
            __k_00 = (puVar55->_M_t).
                     super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
                     super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
                     super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
            local_a0._0_4_ = 3;
            if (*(char **)((long)&(__k_00->super_Importable).super_Named + 8) != sVar64._M_str) {
              p_Var31 = (_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)std::__detail::
                           _Map_base<wasm::ModuleItemKind,_std::pair<const_wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>,_std::allocator<std::pair<const_wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::ModuleItemKind>,_std::hash<wasm::ModuleItemKind>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           ::operator[]((_Map_base<wasm::ModuleItemKind,_std::pair<const_wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>,_std::allocator<std::pair<const_wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::ModuleItemKind>,_std::hash<wasm::ModuleItemKind>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                         *)auStack_398,(key_type *)local_a0);
              pmVar32 = std::__detail::
                        _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                        ::operator[](p_Var31,(key_type *)__k_00);
              (pmVar32->super_IString).str = sVar64;
              *(string_view *)&(__k_00->super_Importable).super_Named = sVar64;
            }
          }
          puVar8 = (((Module *)uVar36)->tags).
                   super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (puVar56 = (((Module *)uVar36)->tags).
                         super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start; puVar56 != puVar8;
              puVar56 = puVar56 + 1) {
            sVar64 = (string_view)
                     wasm::Names::getValidTagName
                               ((Module *)&(anonymous_namespace)::merged,
                                (IString)*(IString *)
                                          &(((puVar56->_M_t).
                                             super___uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_wasm::Tag_*,_std::default_delete<wasm::Tag>_>
                                             .super__Head_base<0UL,_wasm::Tag_*,_false>._M_head_impl
                                            )->super_Importable).super_Named);
            __k_01 = (puVar56->_M_t).
                     super___uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>._M_t.
                     super__Tuple_impl<0UL,_wasm::Tag_*,_std::default_delete<wasm::Tag>_>.
                     super__Head_base<0UL,_wasm::Tag_*,_false>._M_head_impl;
            local_a0._0_4_ = 4;
            if (*(char **)((long)&(__k_01->super_Importable).super_Named + 8) != sVar64._M_str) {
              p_Var31 = (_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)std::__detail::
                           _Map_base<wasm::ModuleItemKind,_std::pair<const_wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>,_std::allocator<std::pair<const_wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::ModuleItemKind>,_std::hash<wasm::ModuleItemKind>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           ::operator[]((_Map_base<wasm::ModuleItemKind,_std::pair<const_wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>,_std::allocator<std::pair<const_wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::ModuleItemKind>,_std::hash<wasm::ModuleItemKind>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                         *)auStack_398,(key_type *)local_a0);
              pmVar32 = std::__detail::
                        _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                        ::operator[](p_Var31,(key_type *)__k_01);
              (pmVar32->super_IString).str = sVar64;
              *(string_view *)&(__k_01->super_Importable).super_Named = sVar64;
            }
          }
          puVar9 = (((Module *)uVar36)->elementSegments).
                   super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (puVar57 = (((Module *)uVar36)->elementSegments).
                         super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start; puVar57 != puVar9;
              puVar57 = puVar57 + 1) {
            sVar64 = (string_view)
                     wasm::Names::getValidElementSegmentName
                               ((Module *)&(anonymous_namespace)::merged,
                                (Name)*(string_view *)
                                       (puVar57->_M_t).
                                       super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                                       .super__Head_base<0UL,_wasm::ElementSegment_*,_false>.
                                       _M_head_impl);
            __k_02 = (string_view *)
                     (puVar57->_M_t).
                     super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                     .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl;
            local_a0._0_4_ = 6;
            if (__k_02->_M_str != sVar64._M_str) {
              p_Var31 = (_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)std::__detail::
                           _Map_base<wasm::ModuleItemKind,_std::pair<const_wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>,_std::allocator<std::pair<const_wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::ModuleItemKind>,_std::hash<wasm::ModuleItemKind>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           ::operator[]((_Map_base<wasm::ModuleItemKind,_std::pair<const_wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>,_std::allocator<std::pair<const_wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::ModuleItemKind>,_std::hash<wasm::ModuleItemKind>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                         *)auStack_398,(key_type *)local_a0);
              pmVar32 = std::__detail::
                        _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                        ::operator[](p_Var31,(key_type *)__k_02);
              (pmVar32->super_IString).str = sVar64;
              *__k_02 = sVar64;
            }
          }
          puVar10 = (((Module *)uVar36)->memories).
                    super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          for (puVar58 = (((Module *)uVar36)->memories).
                         super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start; puVar58 != puVar10;
              puVar58 = puVar58 + 1) {
            sVar64 = (string_view)
                     wasm::Names::getValidMemoryName
                               ((Module *)&(anonymous_namespace)::merged,
                                (IString)*(IString *)
                                          &(((puVar58->_M_t).
                                             super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>
                                             .super__Head_base<0UL,_wasm::Memory_*,_false>.
                                            _M_head_impl)->super_Importable).super_Named);
            __k_03 = (puVar58->_M_t).
                     super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
                     super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                     super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl;
            local_a0._0_4_ = 2;
            if (*(char **)((long)&(__k_03->super_Importable).super_Named + 8) != sVar64._M_str) {
              p_Var31 = (_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)std::__detail::
                           _Map_base<wasm::ModuleItemKind,_std::pair<const_wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>,_std::allocator<std::pair<const_wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::ModuleItemKind>,_std::hash<wasm::ModuleItemKind>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           ::operator[]((_Map_base<wasm::ModuleItemKind,_std::pair<const_wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>,_std::allocator<std::pair<const_wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::ModuleItemKind>,_std::hash<wasm::ModuleItemKind>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                         *)auStack_398,(key_type *)local_a0);
              pmVar32 = std::__detail::
                        _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                        ::operator[](p_Var31,(key_type *)__k_03);
              (pmVar32->super_IString).str = sVar64;
              *(string_view *)&(__k_03->super_Importable).super_Named = sVar64;
            }
          }
          puVar11 = (((Module *)uVar36)->dataSegments).
                    super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          for (puVar59 = (((Module *)uVar36)->dataSegments).
                         super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start; puVar59 != puVar11;
              puVar59 = puVar59 + 1) {
            sVar64 = (string_view)
                     wasm::Names::getValidDataSegmentName
                               ((Module *)&(anonymous_namespace)::merged,
                                (IString)(((puVar59->_M_t).
                                           super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>
                                           .super__Head_base<0UL,_wasm::DataSegment_*,_false>.
                                          _M_head_impl)->super_Named).name.super_IString);
            __k_04 = (puVar59->_M_t).
                     super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>
                     .super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl;
            local_a0._0_4_ = 5;
            if (*(char **)((long)&(__k_04->super_Named).name + 8) != sVar64._M_str) {
              p_Var31 = (_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)std::__detail::
                           _Map_base<wasm::ModuleItemKind,_std::pair<const_wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>,_std::allocator<std::pair<const_wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::ModuleItemKind>,_std::hash<wasm::ModuleItemKind>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           ::operator[]((_Map_base<wasm::ModuleItemKind,_std::pair<const_wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>,_std::allocator<std::pair<const_wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::ModuleItemKind>,_std::hash<wasm::ModuleItemKind>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                         *)auStack_398,(key_type *)local_a0);
              pmVar32 = std::__detail::
                        _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                        ::operator[](p_Var31,(key_type *)__k_04);
              (pmVar32->super_IString).str = sVar64;
              (__k_04->super_Named).name = (Name)sVar64;
            }
          }
          puVar12 = (((Module *)uVar36)->tables).
                    super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          for (puVar60 = (((Module *)uVar36)->tables).
                         super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start; puVar60 != puVar12;
              puVar60 = puVar60 + 1) {
            sVar64 = (string_view)
                     wasm::Names::getValidTableName
                               ((Module *)&(anonymous_namespace)::merged,
                                (IString)*(IString *)
                                          &(((puVar60->_M_t).
                                             super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>
                                             .super__Head_base<0UL,_wasm::Table_*,_false>.
                                            _M_head_impl)->super_Importable).super_Named);
            __k_05 = (puVar60->_M_t).
                     super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>._M_t.
                     super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
                     super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl;
            local_a0._0_4_ = 1;
            if (*(char **)((long)&(__k_05->super_Importable).super_Named + 8) != sVar64._M_str) {
              p_Var31 = (_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)std::__detail::
                           _Map_base<wasm::ModuleItemKind,_std::pair<const_wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>,_std::allocator<std::pair<const_wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::ModuleItemKind>,_std::hash<wasm::ModuleItemKind>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           ::operator[]((_Map_base<wasm::ModuleItemKind,_std::pair<const_wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>,_std::allocator<std::pair<const_wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::ModuleItemKind>,_std::hash<wasm::ModuleItemKind>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                         *)auStack_398,(key_type *)local_a0);
              pmVar32 = std::__detail::
                        _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                        ::operator[](p_Var31,(key_type *)__k_05);
              (pmVar32->super_IString).str = sVar64;
              *(string_view *)&(__k_05->super_Importable).super_Named = sVar64;
            }
          }
          anon_unknown.dwarf_3e58a::updateNames((Module *)uVar36,(KindNameUpdates *)auStack_398);
          std::
          _Hashtable<wasm::ModuleItemKind,_std::pair<const_wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>,_std::allocator<std::pair<const_wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::ModuleItemKind>,_std::hash<wasm::ModuleItemKind>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::~_Hashtable((_Hashtable<wasm::ModuleItemKind,_std::pair<const_wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>,_std::allocator<std::pair<const_wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::ModuleItemKind>,_std::hash<wasm::ModuleItemKind>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                         *)auStack_398);
          __k_06 = (key_type *)&(anonymous_namespace)::merged;
          wasm::ModuleUtils::copyModuleItems
                    ((Module *)uVar36,(Module *)&(anonymous_namespace)::merged);
          puVar13 = (((Module *)uVar36)->exports).
                    super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          for (puVar52 = (((Module *)uVar36)->exports).
                         super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start; puVar52 != puVar13;
              puVar52 = puVar52 + 1) {
            pEVar14 = (puVar52->_M_t).
                      super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
                      super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
                      super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
            local_168._0_8_ = operator_new(0x30);
            sVar5 = *(size_t *)pEVar14;
            pcVar47 = *(char **)(pEVar14 + 8);
            sVar20 = *(size_t *)(pEVar14 + 0x10);
            pcVar46 = *(char **)(pEVar14 + 0x18);
            pcVar21 = *(char **)(pEVar14 + 0x28);
            ((string_view *)(local_168._0_8_ + 0x20))->_M_len = *(size_t *)(pEVar14 + 0x20);
            ((string_view *)(local_168._0_8_ + 0x20))->_M_str = pcVar21;
            ((string_view *)(local_168._0_8_ + 0x10))->_M_len = sVar20;
            ((string_view *)(local_168._0_8_ + 0x10))->_M_str = pcVar46;
            ((string_view *)local_168._0_8_)->_M_len = sVar5;
            ((string_view *)local_168._0_8_)->_M_str = pcVar47;
            pEVar14 = (puVar52->_M_t).
                      super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
                      super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
                      super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
            auStack_398 = *(undefined1 (*) [8])pEVar14;
            writer._0_8_ = *(undefined8 *)(pEVar14 + 8);
            local_140 = (undefined1  [8])local_168._0_8_;
            pmVar33 = std::
                      unordered_map<wasm::Export_*,_(anonymous_namespace)::ExportInfo,_std::hash<wasm::Export_*>,_std::equal_to<wasm::Export_*>,_std::allocator<std::pair<wasm::Export_*const,_(anonymous_namespace)::ExportInfo>_>_>
                      ::operator[]((unordered_map<wasm::Export_*,_(anonymous_namespace)::ExportInfo,_std::hash<wasm::Export_*>,_std::equal_to<wasm::Export_*>,_std::allocator<std::pair<wasm::Export_*const,_(anonymous_namespace)::ExportInfo>_>_>
                                    *)local_168,__k_06);
            (pmVar33->moduleName).super_IString.str._M_len = auVar63._0_8_;
            (pmVar33->moduleName).super_IString.str._M_str = (char *)inputFile.field_2._8_8_;
            (pmVar33->baseName).super_IString.str._M_len = (size_t)auStack_398;
            (pmVar33->baseName).super_IString.str._M_str = (char *)writer._0_8_;
            __k_06 = (key_type *)*(size_t *)local_140;
            sVar64 = (string_view)
                     wasm::Names::getValidExportName
                               ((Module *)&(anonymous_namespace)::merged,
                                (Name)*(string_view *)local_140);
            *(string_view *)local_140 = sVar64;
            if (sVar64._M_str ==
                *(char **)((puVar52->_M_t).
                           super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>.
                           _M_t.
                           super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>
                           .super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl + 8)) {
LAB_0010bd4c:
              __k_06 = (key_type *)local_140;
              wasm::Module::addExport((unique_ptr *)&(anonymous_namespace)::merged);
            }
            else if ((anonymous_namespace)::exportMergeMode != 2) {
              if ((anonymous_namespace)::exportMergeMode != 0) goto LAB_0010bd4c;
              auVar43 = local_140;
              wasm::Fatal::Fatal((Fatal *)auStack_398);
              this = &writer.options;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)this,"Export name conflict: ",0x16);
              pEVar14 = (puVar52->_M_t).
                        super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t
                        .super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
                        super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
              NVar62.super_IString.str._M_str = (char *)auVar43;
              NVar62.super_IString.str._M_len = *(size_t *)(pEVar14 + 8);
              wasm::operator<<((wasm *)this,*(ostream **)pEVar14,NVar62);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)this," (consider",10);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)this," --rename-export-conflicts or",0x1d);
              wasm::Fatal::operator<<
                        ((Fatal *)auStack_398,(char (*) [27])" --skip-export-conflicts)\n");
              goto LAB_0010dd72;
            }
            if (local_140 != (undefined1  [8])0x0) {
              __k_06 = (key_type *)0x30;
              operator_delete((void *)local_140,0x30);
            }
          }
          if ((((Module *)uVar36)->start).super_IString.str._M_str != (char *)0x0) {
            if (DAT_001273f0 == (char *)0x0) {
              _DAT_001273e8 = (char *)(((Module *)uVar36)->start).super_IString.str._M_len;
              DAT_001273f0 = (((Module *)uVar36)->start).super_IString.str._M_str;
            }
            else {
              NVar62.super_IString.str = (IString)wasm::IString::interned(0x10,"merged.start.old",0)
              ;
              NVar65 = wasm::Names::getValidFunctionName
                                 ((Module *)&(anonymous_namespace)::merged,NVar62);
              inputFile.field_2._8_8_ = NVar65.super_IString.str._M_str;
              NVar62.super_IString.str = (IString)wasm::IString::interned(0x10,"merged.start.new",0)
              ;
              NVar62 = wasm::Names::getValidFunctionName
                                 ((Module *)&(anonymous_namespace)::merged,NVar62);
              NVar66.super_IString.str._M_str = _DAT_001273e8;
              NVar66.super_IString.str._M_len = (size_t)&(anonymous_namespace)::merged;
              uVar34 = wasm::Module::getFunction(NVar66);
              writer._16_8_ = writer._16_8_ & 0xffffffffffffff00;
              kindModuleExportMaps._M_h._M_before_begin._M_nxt =
                   kindModuleExportMaps._M_h._M_before_begin._M_nxt & 0xffffffffffffff00;
              lVar35 = wasm::ModuleUtils::copyFunction
                                 (uVar34,&(anonymous_namespace)::merged,
                                  NVar65.super_IString.str._M_len,inputFile.field_2._8_8_,
                                  auStack_398,local_a0);
              if (((char)kindModuleExportMaps._M_h._M_before_begin._M_nxt == '\x01') &&
                 (kindModuleExportMaps._M_h._M_before_begin._M_nxt =
                       kindModuleExportMaps._M_h._M_before_begin._M_nxt & 0xffffffffffffff00,
                 local_a0 != (undefined1  [8])0x0)) {
                operator_delete((void *)local_a0,
                                kindModuleExportMaps._M_h._M_bucket_count - (long)local_a0);
              }
              if ((writer.binary == true) &&
                 (writer._16_8_ = writer._16_8_ & 0xffffffffffffff00,
                 auStack_398 != (undefined1  [8])0x0)) {
                operator_delete((void *)auStack_398,(long)writer.options - (long)auStack_398);
              }
              NVar67.super_IString.str._M_str =
                   (char *)(((Module *)uVar36)->start).super_IString.str._M_len;
              NVar67.super_IString.str._M_len = (size_t)&(anonymous_namespace)::merged;
              uVar36 = wasm::Module::getFunction(NVar67);
              pcStack_128 = (char *)((ulong)pcStack_128 & 0xffffffffffffff00);
              wasm::ModuleUtils::copyFunction
                        (uVar36,&(anonymous_namespace)::merged,NVar62.super_IString.str._M_len,
                         NVar62.super_IString.str._M_str);
              if (((char)pcStack_128 == '\x01') &&
                 (pcStack_128 = (char *)((ulong)pcStack_128 & 0xffffffffffffff00),
                 local_140 != (undefined1  [8])0x0)) {
                operator_delete((void *)local_140,(long)local_130._M_nxt - (long)local_140);
              }
              auStack_418 = (undefined1  [8])&(anonymous_namespace)::merged;
              left = *(Expression **)(lVar35 + 0x60);
              local_168._0_8_ = (string_view *)0x0;
              local_168._8_8_ = (pointer)0x0;
              local_168._16_8_ = (_Hash_node_base *)0x0;
              args = (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)local_168;
              right = wasm::Builder::makeCall((Builder *)auStack_418,NVar62,args,(Type)0x0,false);
              type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
              super__Optional_payload_base<wasm::Type>._8_8_ = 0;
              type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
              super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)args
              ;
              pBVar37 = wasm::Builder::makeSequence
                                  ((Builder *)auStack_418,left,(Expression *)right,type);
              *(Block **)(lVar35 + 0x60) = pBVar37;
              if ((string_view *)local_168._0_8_ != (string_view *)0x0) {
                operator_delete((void *)local_168._0_8_,local_168._16_8_ - local_168._0_8_);
              }
              DAT_001273f0 = (char *)inputFile.field_2._8_8_;
              _DAT_001273e8 = NVar65.super_IString.str._M_len;
            }
          }
          if ((options._177_1_ == '\x01') &&
             (cVar26 = wasm::WasmValidator::validate((Module *)auStack_398,0x127328), cVar26 == '\0'
             )) {
            poVar30 = (ostream *)
                      std::operator<<((ostream *)&std::cout,(Module *)&(anonymous_namespace)::merged
                                     );
            auStack_398[0] = 10;
            std::__ostream_insert<char,std::char_traits<char>>(poVar30,auStack_398,1);
            wasm::Fatal::Fatal((Fatal *)auStack_398);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&writer.options,"error in validating merged after: ",0x22);
            wasm::Fatal::operator<<
                      ((Fatal *)auStack_398,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&inputSourceMapFilename.field_2 + 8));
            goto LAB_0010dd72;
          }
        }
        std::unique_ptr<wasm::Module,_std::default_delete<wasm::Module>_>::~unique_ptr
                  ((unique_ptr<wasm::Module,_std::default_delete<wasm::Module>_> *)
                   ((long)&WasmMergeOption.field_2 + 8));
        if ((size_type *)inputFileName.field_2._8_8_ != &inputSourceMapFilename._M_string_length) {
          operator_delete((void *)inputFileName.field_2._8_8_,
                          inputSourceMapFilename._M_string_length + 1);
        }
        if (psStack_108 != &inputFileName._M_string_length) {
          operator_delete(psStack_108,inputFileName._M_string_length + 1);
        }
        if ((size_type *)inputSourceMapFilename.field_2._8_8_ != &inputFile._M_string_length) {
          operator_delete((void *)inputSourceMapFilename.field_2._8_8_,
                          inputFile._M_string_length + 1);
        }
        local_170._M_b._M_p._0_4_ = (int)local_170._M_b._M_p + 1;
        local_170._M_b._M_p._4_4_ = 0;
        import_00 = (Importable *)
                    ((long)inputFiles.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start - (long)auStack_1c8 >> 5);
      } while ((ulong)local_170._M_b._M_p < import_00);
    }
    puVar23 = DAT_00127330;
    local_a0 = (undefined1  [8])&kindModuleExportMaps._M_h._M_rehash_policy._M_next_resize;
    kindModuleExportMaps._M_h._M_buckets = (__buckets_ptr)0x1;
    kindModuleExportMaps._M_h._M_bucket_count = 0;
    kindModuleExportMaps._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    kindModuleExportMaps._M_h._M_element_count._0_4_ = 0x3f800000;
    kindModuleExportMaps._M_h._M_rehash_policy._M_max_load_factor = 0.0;
    kindModuleExportMaps._M_h._M_rehash_policy._4_4_ = 0;
    kindModuleExportMaps._M_h._M_rehash_policy._M_next_resize = 0;
    if ((anonymous_namespace)::merged != DAT_00127330) {
      puVar48 = (anonymous_namespace)::merged;
      do {
        paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar48;
        if (*(char *)((long)paVar15 + 0x28) == '\0') {
          __k_07 = (unordered_map<wasm::Export_*,_(anonymous_namespace)::ExportInfo,_std::hash<wasm::Export_*>,_std::equal_to<wasm::Export_*>,_std::allocator<std::pair<wasm::Export_*const,_(anonymous_namespace)::ExportInfo>_>_>
                    *)auStack_398;
          auStack_398 = (undefined1  [8])paVar15;
          p_Var38 = std::
                    _Hashtable<wasm::Export_*,_std::pair<wasm::Export_*const,_(anonymous_namespace)::ExportInfo>,_std::allocator<std::pair<wasm::Export_*const,_(anonymous_namespace)::ExportInfo>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Export_*>,_std::hash<wasm::Export_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    ::_M_find_node((_Hashtable<wasm::Export_*,_std::pair<wasm::Export_*const,_(anonymous_namespace)::ExportInfo>,_std::allocator<std::pair<wasm::Export_*const,_(anonymous_namespace)::ExportInfo>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Export_*>,_std::hash<wasm::Export_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                                    *)((ulong)paVar15 % DAT_00127720),(size_type)auStack_398,
                                   (key_type *)((ulong)paVar15 % DAT_00127720),0);
          if (p_Var38 == (__node_ptr)0x0) {
            __assert_fail("exportModuleMap.count(ex.get())",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-merge.cpp"
                          ,0x1c0,"void (anonymous namespace)::fuseImportsAndExports()");
          }
          auStack_398 = (undefined1  [8])paVar15;
          pmVar33 = std::
                    unordered_map<wasm::Export_*,_(anonymous_namespace)::ExportInfo,_std::hash<wasm::Export_*>,_std::equal_to<wasm::Export_*>,_std::allocator<std::pair<wasm::Export_*const,_(anonymous_namespace)::ExportInfo>_>_>
                    ::operator[]((unordered_map<wasm::Export_*,_(anonymous_namespace)::ExportInfo,_std::hash<wasm::Export_*>,_std::equal_to<wasm::Export_*>,_std::allocator<std::pair<wasm::Export_*const,_(anonymous_namespace)::ExportInfo>_>_>
                                  *)auStack_398,(key_type *)__k_07);
          p_Var39 = (_Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     *)std::__detail::
                       _Map_base<wasm::ExternalKind,_std::pair<const_wasm::ExternalKind,_std::unordered_map<wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>_>_>,_std::allocator<std::pair<const_wasm::ExternalKind,_std::unordered_map<wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::ExternalKind>,_std::hash<wasm::ExternalKind>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                       ::operator[]((_Map_base<wasm::ExternalKind,_std::pair<const_wasm::ExternalKind,_std::unordered_map<wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>_>_>,_std::allocator<std::pair<const_wasm::ExternalKind,_std::unordered_map<wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::ExternalKind>,_std::hash<wasm::ExternalKind>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                     *)local_a0,(key_type *)(*puVar48 + 0x10));
          p_Var31 = (_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     *)std::__detail::
                       _Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                       ::operator[](p_Var39,&pmVar33->moduleName);
          pmVar32 = std::__detail::
                    _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[](p_Var31,&pmVar33->baseName);
          uVar17 = *(undefined4 *)((long)paVar15 + 0x1c);
          uVar18 = *(undefined4 *)(paVar15 + 2);
          uVar19 = *(undefined4 *)((long)paVar15 + 0x24);
          *(undefined4 *)&(pmVar32->super_IString).str._M_len =
               *(undefined4 *)((long)paVar15 + 0x18);
          *(undefined4 *)((long)&(pmVar32->super_IString).str._M_len + 4) = uVar17;
          *(undefined4 *)&(pmVar32->super_IString).str._M_str = uVar18;
          *(undefined4 *)((long)&(pmVar32->super_IString).str._M_str + 4) = uVar19;
        }
        import_00 = (Importable *)0x0;
        puVar48 = puVar48 + 1;
      } while (puVar48 != puVar23);
    }
    puVar50 = DAT_00127348;
    local_140 = (undefined1  [8])auStack_110;
    copy._M_t.super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
    super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
    super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl =
         (__uniq_ptr_data<wasm::Export,_std::default_delete<wasm::Export>,_true,_true>)
         (__uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>)0x1;
    local_130._M_nxt = (_Hash_node_base *)0x0;
    pcStack_128 = (char *)0x0;
    local_120 = 1.0;
    local_118 = 0;
    auStack_110 = (undefined1  [8])0x0;
    for (puVar51 = DAT_00127340; puVar24 = DAT_001273d8, puVar44 = DAT_001273d0, puVar51 != puVar50;
        puVar51 = puVar51 + 1) {
      pkVar16 = (key_type *)*puVar51;
      if (pkVar16[2].super_IString.str._M_len != 0) {
        auStack_398 = (undefined1  [8])((ulong)auStack_398 & 0xffffffff00000000);
        p_Var39 = (_Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   *)std::__detail::
                     _Map_base<wasm::ExternalKind,_std::pair<const_wasm::ExternalKind,_std::unordered_map<wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>_>_>,_std::allocator<std::pair<const_wasm::ExternalKind,_std::unordered_map<wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::ExternalKind>,_std::hash<wasm::ExternalKind>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     ::operator[]((_Map_base<wasm::ExternalKind,_std::pair<const_wasm::ExternalKind,_std::unordered_map<wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>_>_>,_std::allocator<std::pair<const_wasm::ExternalKind,_std::unordered_map<wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::ExternalKind>,_std::hash<wasm::ExternalKind>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                   *)local_a0,(key_type *)auStack_398);
        p_Var31 = (_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   *)std::__detail::
                     _Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     ::operator[](p_Var39,(key_type *)&pkVar16[1].super_IString.str._M_str);
        pmVar32 = std::__detail::
                  _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[](p_Var31,(key_type *)&pkVar16[2].super_IString.str._M_str);
        pcVar47 = (pmVar32->super_IString).str._M_str;
        if (pcVar47 != (char *)0x0) {
          sVar5 = (pmVar32->super_IString).str._M_len;
          kindModuleExportMaps._M_h._M_single_bucket =
               (__node_base_ptr)
               CONCAT44(kindModuleExportMaps._M_h._M_single_bucket._4_4_,auStack_398._0_4_);
          p_Var31 = (_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     *)std::__detail::
                       _Map_base<wasm::ModuleItemKind,_std::pair<const_wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>,_std::allocator<std::pair<const_wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::ModuleItemKind>,_std::hash<wasm::ModuleItemKind>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                       ::operator[]((_Map_base<wasm::ModuleItemKind,_std::pair<const_wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>,_std::allocator<std::pair<const_wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::ModuleItemKind>,_std::hash<wasm::ModuleItemKind>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                     *)local_140,
                                    (key_type *)&kindModuleExportMaps._M_h._M_single_bucket);
          pmVar32 = std::__detail::
                    _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[](p_Var31,pkVar16);
          (pmVar32->super_IString).str._M_len = sVar5;
          (pmVar32->super_IString).str._M_str = pcVar47;
        }
      }
    }
    for (; puVar50 = DAT_001273a8, puVar51 = DAT_001273a0, puVar44 != puVar24; puVar44 = puVar44 + 1
        ) {
      pkVar16 = (key_type *)*puVar44;
      if (pkVar16[2].super_IString.str._M_len != 0) {
        auStack_398._0_4_ = 1;
        p_Var39 = (_Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   *)std::__detail::
                     _Map_base<wasm::ExternalKind,_std::pair<const_wasm::ExternalKind,_std::unordered_map<wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>_>_>,_std::allocator<std::pair<const_wasm::ExternalKind,_std::unordered_map<wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::ExternalKind>,_std::hash<wasm::ExternalKind>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     ::operator[]((_Map_base<wasm::ExternalKind,_std::pair<const_wasm::ExternalKind,_std::unordered_map<wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>_>_>,_std::allocator<std::pair<const_wasm::ExternalKind,_std::unordered_map<wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::ExternalKind>,_std::hash<wasm::ExternalKind>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                   *)local_a0,(key_type *)auStack_398);
        p_Var31 = (_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   *)std::__detail::
                     _Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     ::operator[](p_Var39,(key_type *)&pkVar16[1].super_IString.str._M_str);
        pmVar32 = std::__detail::
                  _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[](p_Var31,(key_type *)&pkVar16[2].super_IString.str._M_str);
        pcVar47 = (pmVar32->super_IString).str._M_str;
        if (pcVar47 != (char *)0x0) {
          sVar5 = (pmVar32->super_IString).str._M_len;
          kindModuleExportMaps._M_h._M_single_bucket =
               (__node_base_ptr)
               CONCAT44(kindModuleExportMaps._M_h._M_single_bucket._4_4_,auStack_398._0_4_);
          p_Var31 = (_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     *)std::__detail::
                       _Map_base<wasm::ModuleItemKind,_std::pair<const_wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>,_std::allocator<std::pair<const_wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::ModuleItemKind>,_std::hash<wasm::ModuleItemKind>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                       ::operator[]((_Map_base<wasm::ModuleItemKind,_std::pair<const_wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>,_std::allocator<std::pair<const_wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::ModuleItemKind>,_std::hash<wasm::ModuleItemKind>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                     *)local_140,
                                    (key_type *)&kindModuleExportMaps._M_h._M_single_bucket);
          pmVar32 = std::__detail::
                    _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[](p_Var31,pkVar16);
          (pmVar32->super_IString).str._M_len = sVar5;
          (pmVar32->super_IString).str._M_str = pcVar47;
        }
      }
    }
    for (; puVar24 = DAT_00127360, puVar44 = DAT_00127358, puVar51 != puVar50; puVar51 = puVar51 + 1
        ) {
      pkVar16 = (key_type *)*puVar51;
      if (pkVar16[2].super_IString.str._M_len != 0) {
        auStack_398._0_4_ = 2;
        p_Var39 = (_Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   *)std::__detail::
                     _Map_base<wasm::ExternalKind,_std::pair<const_wasm::ExternalKind,_std::unordered_map<wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>_>_>,_std::allocator<std::pair<const_wasm::ExternalKind,_std::unordered_map<wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::ExternalKind>,_std::hash<wasm::ExternalKind>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     ::operator[]((_Map_base<wasm::ExternalKind,_std::pair<const_wasm::ExternalKind,_std::unordered_map<wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>_>_>,_std::allocator<std::pair<const_wasm::ExternalKind,_std::unordered_map<wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::ExternalKind>,_std::hash<wasm::ExternalKind>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                   *)local_a0,(key_type *)auStack_398);
        p_Var31 = (_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   *)std::__detail::
                     _Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     ::operator[](p_Var39,(key_type *)&pkVar16[1].super_IString.str._M_str);
        pmVar32 = std::__detail::
                  _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[](p_Var31,(key_type *)&pkVar16[2].super_IString.str._M_str);
        pcVar47 = (pmVar32->super_IString).str._M_str;
        if (pcVar47 != (char *)0x0) {
          sVar5 = (pmVar32->super_IString).str._M_len;
          kindModuleExportMaps._M_h._M_single_bucket =
               (__node_base_ptr)
               CONCAT44(kindModuleExportMaps._M_h._M_single_bucket._4_4_,auStack_398._0_4_);
          p_Var31 = (_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     *)std::__detail::
                       _Map_base<wasm::ModuleItemKind,_std::pair<const_wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>,_std::allocator<std::pair<const_wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::ModuleItemKind>,_std::hash<wasm::ModuleItemKind>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                       ::operator[]((_Map_base<wasm::ModuleItemKind,_std::pair<const_wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>,_std::allocator<std::pair<const_wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::ModuleItemKind>,_std::hash<wasm::ModuleItemKind>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                     *)local_140,
                                    (key_type *)&kindModuleExportMaps._M_h._M_single_bucket);
          pmVar32 = std::__detail::
                    _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[](p_Var31,pkVar16);
          (pmVar32->super_IString).str._M_len = sVar5;
          (pmVar32->super_IString).str._M_str = pcVar47;
        }
      }
    }
    for (; puVar50 = DAT_00127378, puVar51 = DAT_00127370, puVar44 != puVar24; puVar44 = puVar44 + 1
        ) {
      pkVar16 = (key_type *)*puVar44;
      if (pkVar16[2].super_IString.str._M_len != 0) {
        auStack_398._0_4_ = 3;
        p_Var39 = (_Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   *)std::__detail::
                     _Map_base<wasm::ExternalKind,_std::pair<const_wasm::ExternalKind,_std::unordered_map<wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>_>_>,_std::allocator<std::pair<const_wasm::ExternalKind,_std::unordered_map<wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::ExternalKind>,_std::hash<wasm::ExternalKind>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     ::operator[]((_Map_base<wasm::ExternalKind,_std::pair<const_wasm::ExternalKind,_std::unordered_map<wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>_>_>,_std::allocator<std::pair<const_wasm::ExternalKind,_std::unordered_map<wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::ExternalKind>,_std::hash<wasm::ExternalKind>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                   *)local_a0,(key_type *)auStack_398);
        p_Var31 = (_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   *)std::__detail::
                     _Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     ::operator[](p_Var39,(key_type *)&pkVar16[1].super_IString.str._M_str);
        pmVar32 = std::__detail::
                  _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[](p_Var31,(key_type *)&pkVar16[2].super_IString.str._M_str);
        pcVar47 = (pmVar32->super_IString).str._M_str;
        if (pcVar47 != (char *)0x0) {
          sVar5 = (pmVar32->super_IString).str._M_len;
          kindModuleExportMaps._M_h._M_single_bucket =
               (__node_base_ptr)
               CONCAT44(kindModuleExportMaps._M_h._M_single_bucket._4_4_,auStack_398._0_4_);
          p_Var31 = (_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     *)std::__detail::
                       _Map_base<wasm::ModuleItemKind,_std::pair<const_wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>,_std::allocator<std::pair<const_wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::ModuleItemKind>,_std::hash<wasm::ModuleItemKind>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                       ::operator[]((_Map_base<wasm::ModuleItemKind,_std::pair<const_wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>,_std::allocator<std::pair<const_wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::ModuleItemKind>,_std::hash<wasm::ModuleItemKind>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                     *)local_140,
                                    (key_type *)&kindModuleExportMaps._M_h._M_single_bucket);
          pmVar32 = std::__detail::
                    _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[](p_Var31,pkVar16);
          (pmVar32->super_IString).str._M_len = sVar5;
          (pmVar32->super_IString).str._M_str = pcVar47;
        }
      }
    }
    for (; puVar24 = DAT_00127348, puVar51 != puVar50; puVar51 = puVar51 + 1) {
      pkVar16 = (key_type *)*puVar51;
      if (pkVar16[2].super_IString.str._M_len != 0) {
        auStack_398._0_4_ = 4;
        p_Var39 = (_Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   *)std::__detail::
                     _Map_base<wasm::ExternalKind,_std::pair<const_wasm::ExternalKind,_std::unordered_map<wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>_>_>,_std::allocator<std::pair<const_wasm::ExternalKind,_std::unordered_map<wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::ExternalKind>,_std::hash<wasm::ExternalKind>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     ::operator[]((_Map_base<wasm::ExternalKind,_std::pair<const_wasm::ExternalKind,_std::unordered_map<wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>_>_>,_std::allocator<std::pair<const_wasm::ExternalKind,_std::unordered_map<wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::ExternalKind>,_std::hash<wasm::ExternalKind>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                   *)local_a0,(key_type *)auStack_398);
        p_Var31 = (_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   *)std::__detail::
                     _Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     ::operator[](p_Var39,(key_type *)&pkVar16[1].super_IString.str._M_str);
        pmVar32 = std::__detail::
                  _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[](p_Var31,(key_type *)&pkVar16[2].super_IString.str._M_str);
        pcVar47 = (pmVar32->super_IString).str._M_str;
        if (pcVar47 != (char *)0x0) {
          sVar5 = (pmVar32->super_IString).str._M_len;
          kindModuleExportMaps._M_h._M_single_bucket =
               (__node_base_ptr)
               CONCAT44(kindModuleExportMaps._M_h._M_single_bucket._4_4_,auStack_398._0_4_);
          p_Var31 = (_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     *)std::__detail::
                       _Map_base<wasm::ModuleItemKind,_std::pair<const_wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>,_std::allocator<std::pair<const_wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::ModuleItemKind>,_std::hash<wasm::ModuleItemKind>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                       ::operator[]((_Map_base<wasm::ModuleItemKind,_std::pair<const_wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>,_std::allocator<std::pair<const_wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::ModuleItemKind>,_std::hash<wasm::ModuleItemKind>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                     *)local_140,
                                    (key_type *)&kindModuleExportMaps._M_h._M_single_bucket);
          pmVar32 = std::__detail::
                    _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[](p_Var31,pkVar16);
          (pmVar32->super_IString).str._M_len = sVar5;
          (pmVar32->super_IString).str._M_str = pcVar47;
        }
      }
    }
    kindModuleExportMaps._M_h._M_single_bucket =
         (__node_base_ptr)CONCAT71(kindModuleExportMaps._M_h._M_single_bucket._1_7_,1);
    puVar50 = DAT_001273a0;
    puVar51 = DAT_001273a8;
    puVar44 = DAT_001273d0;
    puVar22 = DAT_001273d8;
    if (DAT_00127340 != DAT_00127348) {
      puVar49 = DAT_00127340;
      do {
        pcVar47 = (char *)*puVar49;
        if (*(long *)(pcVar47 + 0x20) != 0) {
          auStack_398 = (undefined1  [8])((ulong)auStack_398 & 0xffffffff00000000);
          p_Var39 = (_Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     *)std::__detail::
                       _Map_base<wasm::ExternalKind,_std::pair<const_wasm::ExternalKind,_std::unordered_map<wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>_>_>,_std::allocator<std::pair<const_wasm::ExternalKind,_std::unordered_map<wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::ExternalKind>,_std::hash<wasm::ExternalKind>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                       ::operator[]((_Map_base<wasm::ExternalKind,_std::pair<const_wasm::ExternalKind,_std::unordered_map<wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>_>_>,_std::allocator<std::pair<const_wasm::ExternalKind,_std::unordered_map<wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::ExternalKind>,_std::hash<wasm::ExternalKind>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                     *)local_a0,(key_type *)auStack_398);
          p_Var31 = (_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     *)std::__detail::
                       _Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                       ::operator[](p_Var39,(key_type *)(pcVar47 + 0x18));
          pmVar32 = std::__detail::
                    _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[](p_Var31,(key_type *)(pcVar47 + 0x28));
          if ((pmVar32->super_IString).str._M_str != (char *)0x0) {
            NVar65.super_IString.str._M_str = (char *)(pmVar32->super_IString).str._M_len;
            NVar65.super_IString.str._M_len = (size_t)&(anonymous_namespace)::merged;
            lVar35 = wasm::Module::getFunction(NVar65);
            cVar26 = wasm::HeapType::isSubType
                               ((HeapType)*(uintptr_t *)(lVar35 + 0x38),
                                (HeapType)*(uintptr_t *)(pcVar47 + 0x38));
            if (cVar26 == '\0') {
              anon_unknown.dwarf_3e58a::reportTypeMismatch
                        ((anon_unknown_dwarf_3e58a *)&kindModuleExportMaps._M_h._M_single_bucket,
                         (bool *)"function",pcVar47,import_00);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"type ",5);
              poVar30 = (ostream *)
                        wasm::operator<<((ostream *)&std::cerr,
                                         (HeapType)*(uintptr_t *)(lVar35 + 0x38));
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar30," is not a subtype of ",0x15);
              poVar30 = (ostream *)
                        wasm::operator<<(poVar30,(HeapType)*(uintptr_t *)(pcVar47 + 0x38));
              std::__ostream_insert<char,std::char_traits<char>>(poVar30,".\n",2);
            }
          }
        }
        puVar49 = puVar49 + 1;
        puVar50 = DAT_001273a0;
        puVar51 = DAT_001273a8;
        puVar44 = DAT_001273d0;
        puVar22 = DAT_001273d8;
      } while (puVar49 != puVar24);
    }
    for (; uVar36 = DAT_001273d8, bVar61 = puVar44 != DAT_001273d8, DAT_001273a0 = puVar50,
        DAT_001273a8 = puVar51, DAT_001273d8 = puVar22, bVar61; puVar44 = puVar44 + 1) {
      pcVar47 = (char *)*puVar44;
      if (*(long *)(pcVar47 + 0x20) != 0) {
        auStack_398._4_4_ = (undefined4)((ulong)auStack_398 >> 0x20);
        auStack_398._0_4_ = 1;
        p_Var39 = (_Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   *)std::__detail::
                     _Map_base<wasm::ExternalKind,_std::pair<const_wasm::ExternalKind,_std::unordered_map<wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>_>_>,_std::allocator<std::pair<const_wasm::ExternalKind,_std::unordered_map<wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::ExternalKind>,_std::hash<wasm::ExternalKind>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     ::operator[]((_Map_base<wasm::ExternalKind,_std::pair<const_wasm::ExternalKind,_std::unordered_map<wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>_>_>,_std::allocator<std::pair<const_wasm::ExternalKind,_std::unordered_map<wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::ExternalKind>,_std::hash<wasm::ExternalKind>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                   *)local_a0,(key_type *)auStack_398);
        p_Var31 = (_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   *)std::__detail::
                     _Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     ::operator[](p_Var39,(key_type *)(pcVar47 + 0x18));
        pmVar32 = std::__detail::
                  _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[](p_Var31,(key_type *)(pcVar47 + 0x28));
        if ((pmVar32->super_IString).str._M_str != (char *)0x0) {
          NVar68.super_IString.str._M_str = (char *)(pmVar32->super_IString).str._M_len;
          NVar68.super_IString.str._M_len = (size_t)&(anonymous_namespace)::merged;
          lVar35 = wasm::Module::getTable(NVar68);
          if (*(ulong *)(lVar35 + 0x38) < *(ulong *)(pcVar47 + 0x38)) {
            anon_unknown.dwarf_3e58a::reportTypeMismatch
                      ((anon_unknown_dwarf_3e58a *)&kindModuleExportMaps._M_h._M_single_bucket,
                       (bool *)"table",pcVar47,import_00);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"minimal size ",0xd);
            poVar30 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar30," is smaller than expected minimal size ",0x27);
            poVar30 = std::ostream::_M_insert<unsigned_long>((ulong)poVar30);
            std::__ostream_insert<char,std::char_traits<char>>(poVar30,".\n",2);
          }
          import_00 = (Importable *)0xffffffff;
          if (*(Importable **)(pcVar47 + 0x40) != (Importable *)0xffffffff) {
            import_00 = *(Importable **)(lVar35 + 0x40);
            if (import_00 == (Importable *)0xffffffff) {
              anon_unknown.dwarf_3e58a::reportTypeMismatch
                        ((anon_unknown_dwarf_3e58a *)&kindModuleExportMaps._M_h._M_single_bucket,
                         (bool *)"table",pcVar47,(Importable *)0xffffffff);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"expecting a bounded ",0x14);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"table",5);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr," but the imported ",0x12);
              lVar53 = 0xf;
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"table",5);
              poVar30 = (ostream *)&std::cerr;
              pcVar46 = " is unbounded.\n";
            }
            else {
              if (import_00 <= *(Importable **)(pcVar47 + 0x40)) goto LAB_0010c826;
              anon_unknown.dwarf_3e58a::reportTypeMismatch
                        ((anon_unknown_dwarf_3e58a *)&kindModuleExportMaps._M_h._M_single_bucket,
                         (bool *)"table",pcVar47,import_00);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"maximal size ",0xd);
              poVar30 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar30," is larger than expected maximal size ",0x26);
              poVar30 = std::ostream::_M_insert<unsigned_long>((ulong)poVar30);
              lVar53 = 2;
              pcVar46 = ".\n";
            }
            std::__ostream_insert<char,std::char_traits<char>>(poVar30,pcVar46,lVar53);
          }
LAB_0010c826:
          if (*(long *)(lVar35 + 0x50) != *(long *)(pcVar47 + 0x50)) {
            anon_unknown.dwarf_3e58a::reportTypeMismatch
                      ((anon_unknown_dwarf_3e58a *)&kindModuleExportMaps._M_h._M_single_bucket,
                       (bool *)"table",pcVar47,import_00);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"export type ",0xc);
            poVar30 = (ostream *)
                      wasm::operator<<((ostream *)&std::cerr,(Type)*(uintptr_t *)(lVar35 + 0x50));
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar30," is different from import type ",0x1f);
            poVar30 = (ostream *)wasm::operator<<(poVar30,(Type)*(uintptr_t *)(pcVar47 + 0x50));
            std::__ostream_insert<char,std::char_traits<char>>(poVar30,".\n",2);
          }
        }
      }
      puVar50 = DAT_001273a0;
      puVar51 = DAT_001273a8;
      puVar22 = DAT_001273d8;
      DAT_001273d8 = (undefined8 *)uVar36;
    }
    for (; puVar24 = DAT_00127360, puVar44 = DAT_00127358, puVar50 != puVar51; puVar50 = puVar50 + 1
        ) {
      pcVar47 = (char *)*puVar50;
      if (*(long *)(pcVar47 + 0x20) != 0) {
        auStack_398._0_4_ = 2;
        p_Var39 = (_Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   *)std::__detail::
                     _Map_base<wasm::ExternalKind,_std::pair<const_wasm::ExternalKind,_std::unordered_map<wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>_>_>,_std::allocator<std::pair<const_wasm::ExternalKind,_std::unordered_map<wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::ExternalKind>,_std::hash<wasm::ExternalKind>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     ::operator[]((_Map_base<wasm::ExternalKind,_std::pair<const_wasm::ExternalKind,_std::unordered_map<wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>_>_>,_std::allocator<std::pair<const_wasm::ExternalKind,_std::unordered_map<wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::ExternalKind>,_std::hash<wasm::ExternalKind>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                   *)local_a0,(key_type *)auStack_398);
        p_Var31 = (_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   *)std::__detail::
                     _Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     ::operator[](p_Var39,(key_type *)(pcVar47 + 0x18));
        pmVar32 = std::__detail::
                  _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[](p_Var31,(key_type *)(pcVar47 + 0x28));
        if ((pmVar32->super_IString).str._M_str != (char *)0x0) {
          NVar69.super_IString.str._M_str = (char *)(pmVar32->super_IString).str._M_len;
          NVar69.super_IString.str._M_len = (size_t)&(anonymous_namespace)::merged;
          lVar35 = wasm::Module::getMemory(NVar69);
          import_00 = (Importable *)
                      CONCAT71((int7)((ulong)import_00 >> 8),*(long *)(pcVar47 + 0x50) == 3);
          if ((*(long *)(lVar35 + 0x50) == 3) != (*(long *)(pcVar47 + 0x50) == 3)) {
            anon_unknown.dwarf_3e58a::reportTypeMismatch
                      ((anon_unknown_dwarf_3e58a *)&kindModuleExportMaps._M_h._M_single_bucket,
                       (bool *)0x11d08d,pcVar47,import_00);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"index type should match.\n",0x19);
          }
          if (*(ulong *)(lVar35 + 0x38) < *(ulong *)(pcVar47 + 0x38)) {
            anon_unknown.dwarf_3e58a::reportTypeMismatch
                      ((anon_unknown_dwarf_3e58a *)&kindModuleExportMaps._M_h._M_single_bucket,
                       (bool *)0x11d08d,pcVar47,import_00);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"minimal size ",0xd);
            poVar30 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar30," is smaller than expected minimal size ",0x27);
            poVar30 = std::ostream::_M_insert<unsigned_long>((ulong)poVar30);
            std::__ostream_insert<char,std::char_traits<char>>(poVar30,".\n",2);
          }
          if (*(Importable **)(pcVar47 + 0x40) != (Importable *)0xffffffffffffffff) {
            import_00 = *(Importable **)(lVar35 + 0x40);
            if (import_00 == (Importable *)0xffffffffffffffff) {
              anon_unknown.dwarf_3e58a::reportTypeMismatch
                        ((anon_unknown_dwarf_3e58a *)&kindModuleExportMaps._M_h._M_single_bucket,
                         (bool *)0x11d08d,pcVar47,(Importable *)0xffffffffffffffff);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"expecting a bounded ",0x14);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"memory",6);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr," but the imported ",0x12);
              lVar35 = 0xf;
              poVar30 = (ostream *)&std::cerr;
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"memory",6);
              pcVar47 = " is unbounded.\n";
            }
            else {
              if (import_00 <= *(Importable **)(pcVar47 + 0x40)) goto LAB_0010cb04;
              anon_unknown.dwarf_3e58a::reportTypeMismatch
                        ((anon_unknown_dwarf_3e58a *)&kindModuleExportMaps._M_h._M_single_bucket,
                         (bool *)0x11d08d,pcVar47,import_00);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"maximal size ",0xd);
              poVar30 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar30," is larger than expected maximal size ",0x26);
              poVar30 = std::ostream::_M_insert<unsigned_long>((ulong)poVar30);
              lVar35 = 2;
              pcVar47 = ".\n";
            }
            std::__ostream_insert<char,std::char_traits<char>>(poVar30,pcVar47,lVar35);
          }
        }
      }
LAB_0010cb04:
    }
    for (; puVar50 = DAT_00127378, puVar44 != puVar24; puVar44 = puVar44 + 1) {
      pcVar47 = (char *)*puVar44;
      if (*(long *)(pcVar47 + 0x20) != 0) {
        auStack_398._0_4_ = 3;
        p_Var39 = (_Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   *)std::__detail::
                     _Map_base<wasm::ExternalKind,_std::pair<const_wasm::ExternalKind,_std::unordered_map<wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>_>_>,_std::allocator<std::pair<const_wasm::ExternalKind,_std::unordered_map<wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::ExternalKind>,_std::hash<wasm::ExternalKind>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     ::operator[]((_Map_base<wasm::ExternalKind,_std::pair<const_wasm::ExternalKind,_std::unordered_map<wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>_>_>,_std::allocator<std::pair<const_wasm::ExternalKind,_std::unordered_map<wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::ExternalKind>,_std::hash<wasm::ExternalKind>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                   *)local_a0,(key_type *)auStack_398);
        p_Var31 = (_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   *)std::__detail::
                     _Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     ::operator[](p_Var39,(key_type *)(pcVar47 + 0x18));
        pmVar32 = std::__detail::
                  _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[](p_Var31,(key_type *)(pcVar47 + 0x28));
        if ((pmVar32->super_IString).str._M_str != (char *)0x0) {
          NVar70.super_IString.str._M_str = (char *)(pmVar32->super_IString).str._M_len;
          NVar70.super_IString.str._M_len = (size_t)&(anonymous_namespace)::merged;
          lVar35 = wasm::Module::getGlobal(NVar70);
          if (*(char *)(lVar35 + 0x48) != pcVar47[0x48]) {
            anon_unknown.dwarf_3e58a::reportTypeMismatch
                      ((anon_unknown_dwarf_3e58a *)&kindModuleExportMaps._M_h._M_single_bucket,
                       (bool *)"global",pcVar47,import_00);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"mutability should match.\n",0x19);
          }
          if ((*(char *)(lVar35 + 0x48) == '\x01') &&
             (*(long *)(lVar35 + 0x38) != *(long *)(pcVar47 + 0x38))) {
            anon_unknown.dwarf_3e58a::reportTypeMismatch
                      ((anon_unknown_dwarf_3e58a *)&kindModuleExportMaps._M_h._M_single_bucket,
                       (bool *)"global",pcVar47,import_00);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"export type ",0xc);
            poVar30 = (ostream *)
                      wasm::operator<<((ostream *)&std::cerr,(Type)*(uintptr_t *)(lVar35 + 0x38));
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar30," is different from import type ",0x1f);
            poVar30 = (ostream *)wasm::operator<<(poVar30,(Type)*(uintptr_t *)(pcVar47 + 0x38));
            std::__ostream_insert<char,std::char_traits<char>>(poVar30,".\n",2);
          }
          if ((*(char *)(lVar35 + 0x48) == '\0') &&
             (cVar26 = wasm::Type::isSubType
                                 ((Type)*(uintptr_t *)(lVar35 + 0x38),
                                  (Type)*(uintptr_t *)(pcVar47 + 0x38)), cVar26 == '\0')) {
            anon_unknown.dwarf_3e58a::reportTypeMismatch
                      ((anon_unknown_dwarf_3e58a *)&kindModuleExportMaps._M_h._M_single_bucket,
                       (bool *)"global",pcVar47,import_00);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"type ",5);
            poVar30 = (ostream *)
                      wasm::operator<<((ostream *)&std::cerr,(Type)*(uintptr_t *)(lVar35 + 0x38));
            std::__ostream_insert<char,std::char_traits<char>>(poVar30," is not a subtype of ",0x15)
            ;
            poVar30 = (ostream *)wasm::operator<<(poVar30,(Type)*(uintptr_t *)(pcVar47 + 0x38));
            std::__ostream_insert<char,std::char_traits<char>>(poVar30,".\n",2);
          }
        }
      }
    }
    if (DAT_00127370 != DAT_00127378) {
      puVar51 = DAT_00127370;
      do {
        pcVar47 = (char *)*puVar51;
        if (*(long *)(pcVar47 + 0x20) != 0) {
          auStack_398._0_4_ = 4;
          p_Var39 = (_Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     *)std::__detail::
                       _Map_base<wasm::ExternalKind,_std::pair<const_wasm::ExternalKind,_std::unordered_map<wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>_>_>,_std::allocator<std::pair<const_wasm::ExternalKind,_std::unordered_map<wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::ExternalKind>,_std::hash<wasm::ExternalKind>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                       ::operator[]((_Map_base<wasm::ExternalKind,_std::pair<const_wasm::ExternalKind,_std::unordered_map<wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>_>_>,_std::allocator<std::pair<const_wasm::ExternalKind,_std::unordered_map<wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::ExternalKind>,_std::hash<wasm::ExternalKind>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                     *)local_a0,(key_type *)auStack_398);
          p_Var31 = (_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     *)std::__detail::
                       _Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                       ::operator[](p_Var39,(key_type *)(pcVar47 + 0x18));
          pmVar32 = std::__detail::
                    _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[](p_Var31,(key_type *)(pcVar47 + 0x28));
          if (((pmVar32->super_IString).str._M_str != (char *)0x0) &&
             (NVar71.super_IString.str._M_str = (char *)(pmVar32->super_IString).str._M_len,
             NVar71.super_IString.str._M_len = (size_t)&(anonymous_namespace)::merged,
             lVar35 = wasm::Module::getTag(NVar71),
             *(long *)(lVar35 + 0x38) != *(long *)(pcVar47 + 0x38))) {
            anon_unknown.dwarf_3e58a::reportTypeMismatch
                      ((anon_unknown_dwarf_3e58a *)&kindModuleExportMaps._M_h._M_single_bucket,
                       (bool *)"tag",pcVar47,import_00);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"export type ",0xc);
            poVar30 = (ostream *)
                      wasm::operator<<((ostream *)&std::cerr,(HeapType)*(uintptr_t *)(lVar35 + 0x38)
                                      );
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar30," is different from import type ",0x1f);
            poVar30 = (ostream *)wasm::operator<<(poVar30,(HeapType)*(uintptr_t *)(pcVar47 + 0x38));
            std::__ostream_insert<char,std::char_traits<char>>(poVar30,".\n",2);
          }
        }
        puVar51 = puVar51 + 1;
      } while (puVar51 != puVar50);
    }
    if ((char)kindModuleExportMaps._M_h._M_single_bucket != '\0') {
      anon_unknown.dwarf_3e58a::updateNames
                ((Module *)&(anonymous_namespace)::merged,(KindNameUpdates *)local_140);
      std::
      _Hashtable<wasm::ModuleItemKind,_std::pair<const_wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>,_std::allocator<std::pair<const_wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::ModuleItemKind>,_std::hash<wasm::ModuleItemKind>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable((_Hashtable<wasm::ModuleItemKind,_std::pair<const_wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>,_std::allocator<std::pair<const_wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::ModuleItemKind>,_std::hash<wasm::ModuleItemKind>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     *)local_140);
      std::
      _Hashtable<wasm::ExternalKind,_std::pair<const_wasm::ExternalKind,_std::unordered_map<wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>_>_>,_std::allocator<std::pair<const_wasm::ExternalKind,_std::unordered_map<wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::ExternalKind>,_std::hash<wasm::ExternalKind>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable((_Hashtable<wasm::ExternalKind,_std::pair<const_wasm::ExternalKind,_std::unordered_map<wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>_>_>,_std::allocator<std::pair<const_wasm::ExternalKind,_std::unordered_map<wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::ExternalKind>,_std::hash<wasm::ExternalKind>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     *)local_a0);
      writer.sourceMapUrl.field_2._8_8_ = &puStack_2f0;
      auStack_398 = (undefined1  [8])std::_Rb_tree_increment;
      writer._0_8_ = &(anonymous_namespace)::merged;
      writer.options = (PassOptions *)&DAT_00127528;
      writer.binary = false;
      writer.emitModuleName = false;
      writer._18_6_ = 0;
      writer.symbolMap._M_dataplus._M_p._0_4_ = 0;
      writer.symbolMap._M_dataplus._M_p._4_4_ = 0;
      writer.symbolMap._M_string_length._0_1_ = 0;
      writer.symbolMap._M_string_length._1_7_ = 0;
      writer.symbolMap.field_2._M_local_buf[0] = '\0';
      writer.symbolMap.field_2._M_allocated_capacity._1_2_ = 0x101;
      writer.symbolMap.field_2._M_allocated_capacity._4_4_ = 0;
      writer.symbolMap.field_2._8_8_ = 0x200000000;
      writer.sourceMapFilename._M_dataplus._M_p = (pointer)0x14ffffffff;
      writer.sourceMapFilename._M_string_length._0_4_ =
           (uint)writer.sourceMapFilename._M_string_length & 0xffffff00;
      writer.sourceMapUrl._M_string_length._0_1_ = 0;
      writer.sourceMapUrl.field_2._M_local_buf[0] = '\0';
      writer.sourceMapFilename._M_string_length._4_4_ = 0;
      writer.sourceMapFilename.field_2._M_allocated_capacity._0_4_ = 0;
      writer.sourceMapFilename.field_2._M_allocated_capacity._4_4_ = 0;
      writer.sourceMapFilename.field_2._M_local_buf[8] = '\0';
      puStack_2f0 = (pointer)0x0;
      local_2e8 = &_Stack_2b8;
      local_2e0 = (pointer)0x1;
      local_2d8 = 0;
      pcStack_2d0 = (char *)0x0;
      local_2c8 = 0x3f800000;
      local_2c0 = (pointer)0x0;
      _Stack_2b8._M_t.super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
      super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl =
           (tuple<wasm::Table_*,_std::default_delete<wasm::Table>_>)
           (_Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>)0x0;
      local_2b0 = 0;
      local_678[0] = local_668;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_678,"reorder-globals-always","");
      local_728 = '\0';
      wasm::PassRunner::add(auStack_398,local_678,local_748);
      if ((local_728 == '\x01') && (local_728 = '\0', local_748[0] != local_738)) {
        operator_delete(local_748[0],local_738[0] + 1);
      }
      if (local_678[0] != local_668) {
        operator_delete(local_678[0],local_668[0] + 1);
      }
      local_658[0] = local_648;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_658,"remove-unused-module-elements","");
      local_700 = '\0';
      wasm::PassRunner::add(auStack_398,local_658,local_720);
      if ((local_700 == '\x01') && (local_700 = '\0', local_720[0] != local_710)) {
        operator_delete(local_720[0],local_710[0] + 1);
      }
      if (local_658[0] != local_648) {
        operator_delete(local_658[0],local_648[0] + 1);
      }
      wasm::PassRunner::run();
      wasm::PassRunner::~PassRunner((PassRunner *)auStack_398);
      auStack_398 = (undefined1  [8])&writer.options;
      std::__cxx11::string::_M_construct<char_const*>((string *)auStack_398,"output","");
      cVar40 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)&options.super_Options,(key_type *)auStack_398);
      if (auStack_398 != (undefined1  [8])&writer.options) {
        operator_delete((void *)auStack_398,(ulong)&(writer.options)->validate);
      }
      if (cVar40._M_node != (_Base_ptr)&options.field_0x10) {
        writer._0_8_ = &options.field_0xb0;
        psVar45 = &writer.symbolMap._M_string_length;
        writer.symbolMap._M_dataplus._M_p._0_4_ = 0;
        writer.symbolMap._M_dataplus._M_p._4_4_ = 0;
        writer.symbolMap._M_string_length._0_1_ = 0;
        psVar2 = &writer.sourceMapFilename._M_string_length;
        writer.sourceMapFilename._M_dataplus._M_p = (pointer)0x0;
        writer.sourceMapFilename._M_string_length._0_4_ =
             (uint)writer.sourceMapFilename._M_string_length & 0xffffff00;
        psVar3 = &writer.sourceMapUrl._M_string_length;
        writer.sourceMapFilename.field_2._M_local_buf[8] = (char)psVar3;
        writer.sourceMapFilename.field_2._9_7_ = (undefined7)((ulong)psVar3 >> 8);
        writer.sourceMapUrl._M_dataplus._M_p = (pointer)0x0;
        writer.sourceMapUrl._M_string_length._0_1_ = 0;
        writer.options =
             (PassOptions *)
             (CONCAT71((int7)((ulong)writer.options >> 8),local_32) & 0xffffffffffff00ff);
        auStack_398[0] = local_31[0];
        writer._16_8_ = psVar45;
        writer.symbolMap.field_2._8_8_ = psVar2;
        if (outputSourceMapFilename._M_dataplus._M_p != (pointer)0x0) {
          local_638[0] = local_628;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_638,local_3f8,
                     outputSourceMapFilename._M_dataplus._M_p + (long)local_3f8);
          std::__cxx11::string::_M_assign((string *)(writer.symbolMap.field_2._M_local_buf + 8));
          if (local_638[0] != local_628) {
            operator_delete(local_638[0],local_628[0] + 1);
          }
          local_618[0] = local_608;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_618,local_208,
                     outputSourceMapUrl._M_dataplus._M_p + (long)local_208);
          std::__cxx11::string::_M_assign
                    ((string *)(writer.sourceMapFilename.field_2._M_local_buf + 8));
          if (local_618[0] != local_608) {
            operator_delete(local_618[0],local_608[0] + 1);
          }
        }
        local_a0 = (undefined1  [8])&kindModuleExportMaps._M_h._M_bucket_count;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"output","");
        pmVar41 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&options.super_Options,(key_type *)local_a0);
        pcVar4 = (pmVar41->_M_dataplus)._M_p;
        local_5f8[0] = local_5e8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_5f8,pcVar4,pcVar4 + pmVar41->_M_string_length);
        wasm::ModuleWriter::write(auStack_398,&(anonymous_namespace)::merged,local_5f8);
        if (local_5f8[0] != local_5e8) {
          operator_delete(local_5f8[0],local_5e8[0] + 1);
        }
        if (local_a0 != (undefined1  [8])&kindModuleExportMaps._M_h._M_bucket_count) {
          operator_delete((void *)local_a0,kindModuleExportMaps._M_h._M_bucket_count + 1);
        }
        if ((size_type *)
            CONCAT71(writer.sourceMapFilename.field_2._9_7_,
                     writer.sourceMapFilename.field_2._M_local_buf[8]) != psVar3) {
          operator_delete((undefined1 *)
                          CONCAT71(writer.sourceMapFilename.field_2._9_7_,
                                   writer.sourceMapFilename.field_2._M_local_buf[8]),
                          CONCAT71(writer.sourceMapUrl._M_string_length._1_7_,
                                   (undefined1)writer.sourceMapUrl._M_string_length) + 1);
        }
        if ((size_type *)writer.symbolMap.field_2._8_8_ != psVar2) {
          operator_delete((void *)writer.symbolMap.field_2._8_8_,
                          CONCAT44(writer.sourceMapFilename._M_string_length._4_4_,
                                   (uint)writer.sourceMapFilename._M_string_length) + 1);
        }
        if ((size_type *)writer._16_8_ != psVar45) {
          operator_delete((void *)writer._16_8_,
                          CONCAT71(writer.symbolMap._M_string_length._1_7_,
                                   (undefined1)writer.symbolMap._M_string_length) + 1);
        }
      }
      wasm::ToolOptions::~ToolOptions((ToolOptions *)local_9b8);
      if (inputFiles.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage !=
          (pointer)&WasmMergeOption._M_string_length) {
        operator_delete(inputFiles.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                        WasmMergeOption._M_string_length + 1);
      }
      if (local_208 != &outputSourceMapUrl._M_string_length) {
        operator_delete(local_208,
                        CONCAT71(outputSourceMapUrl._M_string_length._1_7_,
                                 (undefined1)outputSourceMapUrl._M_string_length) + 1);
      }
      if (local_3f8 != &outputSourceMapFilename._M_string_length) {
        operator_delete(local_3f8,
                        CONCAT71(outputSourceMapFilename._M_string_length._1_7_,
                                 (undefined1)outputSourceMapFilename._M_string_length) + 1);
      }
      std::
      _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&options.enabledFeatures);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)auStack_3b8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)auStack_1c8);
      return 0;
    }
    wasm::Fatal::Fatal((Fatal *)auStack_398);
    wasm::Fatal::operator<<((Fatal *)auStack_398,(char (*) [25])"import/export mismatches");
  }
  else {
    wasm::Fatal::Fatal((Fatal *)auStack_398);
    wasm::Fatal::operator<<
              ((Fatal *)auStack_398,
               (char (*) [161])
               "Please provide an import name for each input file. In particular, the number of positional inputs must be even as each wasm binary must be followed by its name."
              );
  }
LAB_0010dd72:
  wasm::Fatal::~Fatal((Fatal *)auStack_398);
}

Assistant:

int main(int argc, const char* argv[]) {
  std::vector<std::string> inputFiles;
  std::vector<std::string> inputFileNames;
  bool emitBinary = true;
  bool debugInfo = false;
  std::map<size_t, std::string> inputSourceMapFilenames;
  std::string outputSourceMapFilename;
  std::string outputSourceMapUrl;

  const std::string WasmMergeOption = "wasm-merge options";

  ToolOptions options("wasm-merge",
                      R"(Merge wasm files into one.

For example,

  wasm-merge foo.wasm foo bar.wasm bar -o merged.wasm

will read foo.wasm and bar.wasm, with names 'foo' and 'bar' respectively, so if the second imports from 'foo', we will see that as an import from the first module after the merge. The merged output will be written to merged.wasm.

Note that filenames and modules names are interleaved (which is hopefully less confusing).

Input source maps can be specified by adding an -ism option right after the module name:

  wasm-merge foo.wasm foo -ism foo.wasm.map ...)");

  options
    .add("--output",
         "-o",
         "Output file",
         WasmMergeOption,
         Options::Arguments::One,
         [](Options* o, const std::string& argument) {
           o->extra["output"] = argument;
           Colors::setEnabled(false);
         })
    .add_positional("INFILE1 NAME1 INFILE2 NAME2 [..]",
                    Options::Arguments::N,
                    [&](Options* o, const std::string& argument) {
                      if (inputFiles.size() == inputFileNames.size()) {
                        inputFiles.push_back(argument);
                      } else {
                        inputFileNames.push_back(argument);
                      }
                    })
    .add("--input-source-map",
         "-ism",
         "Consume source maps from the specified files",
         WasmMergeOption,
         Options::Arguments::N,
         [&](Options* o, const std::string& argument) {
           size_t pos = inputFiles.size();
           if (pos == 0 || pos != inputFileNames.size() ||
               inputSourceMapFilenames.count(pos - 1)) {
             std::cerr << "Option '-ism " << argument
                       << "' should be right after the module name\n";
             exit(EXIT_FAILURE);
           }
           inputSourceMapFilenames.insert({pos - 1, argument});
         })
    .add("--output-source-map",
         "-osm",
         "Emit source map to the specified file",
         WasmMergeOption,
         Options::Arguments::One,
         [&outputSourceMapFilename](Options* o, const std::string& argument) {
           outputSourceMapFilename = argument;
         })
    .add("--output-source-map-url",
         "-osu",
         "Emit specified string as source map URL",
         WasmMergeOption,
         Options::Arguments::One,
         [&outputSourceMapUrl](Options* o, const std::string& argument) {
           outputSourceMapUrl = argument;
         })
    .add("--rename-export-conflicts",
         "-rec",
         "Rename exports to avoid conflicts (rather than error)",
         WasmMergeOption,
         Options::Arguments::Zero,
         [&](Options* o, const std::string& argument) {
           exportMergeMode = RenameExportConflicts;
         })
    .add("--skip-export-conflicts",
         "-sec",
         "Skip exports that conflict with previous ones",
         WasmMergeOption,
         Options::Arguments::Zero,
         [&](Options* o, const std::string& argument) {
           exportMergeMode = SkipExportConflicts;
         })
    .add("--emit-text",
         "-S",
         "Emit text instead of binary for the output file",
         WasmMergeOption,
         Options::Arguments::Zero,
         [&](Options* o, const std::string& argument) { emitBinary = false; })
    .add("--debuginfo",
         "-g",
         "Emit names section and debug info",
         WasmMergeOption,
         Options::Arguments::Zero,
         [&](Options* o, const std::string& arguments) { debugInfo = true; });
  options.parse(argc, argv);

  if (inputFiles.size() != inputFileNames.size()) {
    Fatal() << "Please provide an import name for each input file. "
               "In particular, the number of positional inputs must be even as "
               "each wasm binary must be followed by its name.";
  }

  // Process the inputs.
  // TODO: If the inputs are a very large number of small modules then it might
  //       make sense to parallelize this. (If so, then changing the existing
  //       parallelism above in NameMapper might make sense.)

  for (Index i = 0; i < inputFiles.size(); i++) {
    auto inputFile = inputFiles[i];
    auto inputFileName = inputFileNames[i];
    auto iter = inputSourceMapFilenames.find(i);
    auto inputSourceMapFilename =
      (iter == inputSourceMapFilenames.end()) ? "" : iter->second;

    if (options.debug) {
      std::cerr << "reading input '" << inputFile << "' as '" << inputFileName
                << "'...\n";
    }

    // For the first input, we'll just read it in directly. For later inputs,
    // we read them and then merge.
    std::unique_ptr<Module> laterInput;
    Module* currModule;
    if (i == 0) {
      currModule = &merged;
    } else {
      laterInput = std::make_unique<Module>();
      currModule = laterInput.get();
    }

    options.applyOptionsBeforeParse(*currModule);

    ModuleReader reader;
    try {
      reader.read(inputFile, *currModule, inputSourceMapFilename);
    } catch (ParseException& p) {
      p.dump(std::cerr);
      Fatal() << "error in parsing wasm input: " << inputFile;
    }

    options.applyOptionsAfterParse(*currModule);

    if (options.passOptions.validate) {
      if (!WasmValidator().validate(*currModule)) {
        std::cout << *currModule << '\n';
        Fatal() << "error in validating input: " << inputFile;
      }
    }

    if (!laterInput) {
      // This is the very first module, which we read directly into |merged|.
      // The only other operation we need to do is note the exports for later.
      for (auto& curr : merged.exports) {
        exportModuleMap[curr.get()] = ExportInfo{inputFileName, curr->name};
      }
    } else {
      // This is a later module: do a full merge.
      mergeInto(*currModule, inputFileName);

      if (options.passOptions.validate) {
        if (!WasmValidator().validate(merged)) {
          std::cout << merged << '\n';
          Fatal() << "error in validating merged after: " << inputFile;
        }
      }
    }
  }

  // Fuse imports and exports now that everything is all together in the merged
  // module.
  fuseImportsAndExports();

  {
    PassRunner passRunner(&merged);
    // We might have made some globals read from others that now appear after
    // them (if the one they read was appended from a later module). Sort them
    // to fix that. TODO: we could do this only if we actually append globals
    passRunner.add("reorder-globals-always");
    // Remove unused things. This is obviously a useful optimization but it also
    // makes using the output easier: if an import was resolved by an export
    // during the merge, then that import will have no more uses and it will be
    // optimized out (while if we didn't optimize it out then instantiating the
    // module would still be forced to provide something for that import).
    passRunner.add("remove-unused-module-elements");
    passRunner.run();
  }

  // Output.
  if (options.extra.count("output") > 0) {
    ModuleWriter writer(options.passOptions);
    writer.setBinary(emitBinary);
    writer.setDebugInfo(debugInfo);
    if (outputSourceMapFilename.size()) {
      writer.setSourceMapFilename(outputSourceMapFilename);
      writer.setSourceMapUrl(outputSourceMapUrl);
    }
    writer.write(merged, options.extra["output"]);
  }
}